

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_opt.c
# Opt level: O2

size_t ZSTD_compressBlock_btultra2
                 (ZSTD_matchState_t *ms,seqStore_t *seqStore,U32 *rep,void *src,size_t srcSize)

{
  BYTE **ppBVar1;
  BYTE *pBVar2;
  ZSTD_optimal_t *pZVar3;
  ZSTD_match_t *pZVar4;
  ZSTD_optimal_t *pZVar5;
  undefined8 uVar6;
  optState_t *poVar7;
  U32 i;
  uint uVar8;
  U32 UVar9;
  U32 UVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  U32 UVar14;
  U32 UVar15;
  U32 UVar16;
  int iVar17;
  size_t sVar18;
  uint *puVar19;
  uint *puVar20;
  U32 *pUVar21;
  long lVar22;
  ZSTD_optimal_t *pZVar23;
  uint *puVar24;
  uint *puVar25;
  uint *puVar26;
  uint *puVar27;
  uint *puVar28;
  ulong uVar29;
  ulong uVar30;
  ulong uVar31;
  U32 *pUVar32;
  ulong uVar33;
  uint uVar34;
  uint uVar35;
  ulong uVar36;
  ulong uVar37;
  int bonus;
  int bonus_00;
  ZSTD_matchState_t *extraout_RDX;
  ZSTD_matchState_t *pZVar38;
  BYTE *base_2;
  uint uVar39;
  uint uVar40;
  BYTE *pBVar41;
  uint uVar42;
  seqStore_t *ssPtr;
  uint uVar43;
  BYTE *base_1;
  ulong uVar44;
  uint *puVar45;
  BYTE *pBVar46;
  BYTE *base;
  bool bVar47;
  repcodes_t rVar48;
  U32 *local_1c0;
  U32 *local_1b8;
  ulong local_1b0;
  U32 *local_1a8;
  U32 *local_198;
  uint *local_188;
  uint *local_180;
  uint *local_178;
  uint *local_170;
  U32 *local_168;
  ulong local_160;
  uint *local_148;
  uint *local_140;
  U32 *local_138;
  U32 local_11c;
  uint *local_118;
  uint *local_110;
  U32 *local_108;
  U32 *local_100;
  undefined8 local_f8;
  U32 local_f0;
  uint *local_e8;
  uint *local_e0;
  ulong local_d8;
  uint *local_d0;
  ulong local_c8;
  uint *local_c0;
  optState_t *local_b8;
  uint *local_b0;
  uint *local_a8;
  ulong local_a0;
  U32 *local_98;
  U32 *local_90;
  ulong local_88;
  U32 *local_80;
  ulong local_78;
  ZSTD_optimal_t *local_70;
  int local_64;
  undefined8 local_60;
  U32 local_58;
  seqStore_t *local_50;
  ulong local_48;
  U32 *local_40;
  U32 *local_38;
  
  pBVar46 = (ms->window).base;
  local_48 = 4;
  local_98 = rep;
  local_50 = seqStore;
  if (((((ms->opt).litLengthSum == 0) && (seqStore->sequences == seqStore->sequencesStart)) &&
      (uVar39 = (ms->window).dictLimit, uVar39 == (ms->window).lowLimit)) &&
     ((0x400 < srcSize && (uVar8 = (int)src - (int)pBVar46, uVar39 == uVar8)))) {
    local_f0 = rep[2];
    local_f8 = *(ulong *)rep;
    local_b8 = &ms->opt;
    uVar39 = (ms->cParams).targetLength;
    if (0xffe < uVar39) {
      uVar39 = 0xfff;
    }
    local_90 = (U32 *)CONCAT44(local_90._4_4_,uVar39);
    pBVar2 = (BYTE *)((long)src + srcSize);
    uVar39 = (ms->cParams).minMatch;
    local_d0 = (uint *)((long)src + (srcSize - 8));
    pZVar4 = (ms->opt).matchTable;
    pZVar5 = (ms->opt).priceTable;
    ms->nextToUpdate3 = ms->nextToUpdate;
    uVar39 = (uint)(uVar39 == 3);
    local_a0 = (ulong)(4 - uVar39);
    local_b0 = (uint *)srcSize;
    ZSTD_rescaleFreqs(local_b8,(BYTE *)src,srcSize,2);
    puVar45 = (uint *)((ulong)(pBVar46 + uVar8 == (BYTE *)src) + (long)src);
    local_e0 = (uint *)(ulong)(uVar39 ^ 3);
    local_70 = pZVar5 + 1;
    local_38 = pZVar5->rep;
    local_a8 = (uint *)src;
    ssPtr = local_50;
    local_148 = (uint *)src;
LAB_00116c45:
    src = local_a8;
    if (puVar45 < local_d0) {
      pBVar46 = (ms->window).base;
      uVar29 = (ulong)ms->nextToUpdate;
      if (pBVar46 + uVar29 <= puVar45) {
        iVar11 = (int)puVar45;
        UVar9 = iVar11 - (int)local_148;
        UVar14 = (ms->cParams).minMatch;
        uVar39 = iVar11 - (int)pBVar46;
        for (; (uint)uVar29 < uVar39; uVar29 = (ulong)((uint)uVar29 + UVar10)) {
          UVar10 = ZSTD_insertBt1(ms,pBVar46 + uVar29,pBVar2,UVar14,0);
        }
        ms->nextToUpdate = uVar39;
        if (1 < UVar14 - 6) {
          if (UVar14 == 5) {
            uVar29 = (ulong)(UVar9 == 0);
            uVar39 = (ms->cParams).targetLength;
            if (0xffe < uVar39) {
              uVar39 = 0xfff;
            }
            pBVar46 = (ms->window).base;
            uVar42 = iVar11 - (int)pBVar46;
            local_110 = (uint *)(ulong)uVar42;
            uVar44 = 0;
            local_108 = (U32 *)((ulong)(*(long *)puVar45 * -0x30e4432345000000) >>
                               (-(char)(ms->cParams).hashLog & 0x3fU));
            pUVar32 = ms->chainTable;
            uVar8 = ~(-1 << ((char)(ms->cParams).chainLog - 1U & 0x1f));
            uVar34 = uVar42 - uVar8;
            if (uVar42 < uVar8) {
              uVar34 = 0;
            }
            UVar14 = (ms->window).lowLimit;
            uVar36 = (ulong)((uVar8 & uVar42) * 2);
            local_1a8 = pUVar32 + uVar36;
            local_1c0 = pUVar32 + uVar36 + 1;
            iVar11 = 1 << ((byte)(ms->cParams).searchLog & 0x1f);
            UVar10 = (ms->window).dictLimit;
            uVar40 = (U32)local_f8 - 1;
            local_100 = ms->hashTable;
            UVar15 = local_100[(long)local_108];
            uVar36 = uVar29 + 3;
            local_118 = puVar45 + 1;
            puVar24 = local_e0;
            for (; uVar29 < uVar36; uVar29 = uVar29 + 1) {
              uVar35 = uVar40;
              if (uVar29 != 3) {
                uVar35 = *(uint *)((long)&local_f8 + uVar29 * 4);
              }
              uVar43 = 0;
              if ((uVar35 - 1 < uVar42 - UVar10) &&
                 (*puVar45 == *(uint *)((long)puVar45 - (ulong)uVar35))) {
                sVar18 = ZSTD_count((BYTE *)local_118,(BYTE *)((long)local_118 - (ulong)uVar35),
                                    pBVar2);
                uVar43 = (int)sVar18 + 4;
              }
              puVar19 = (uint *)(ulong)uVar43;
              if (puVar24 < puVar19) {
                pZVar4[uVar44].off = (int)uVar29 - (uint)(UVar9 == 0);
                pZVar4[uVar44].len = uVar43;
                uVar44 = (ulong)((int)uVar44 + 1);
                if ((uVar39 < uVar43) ||
                   (puVar24 = puVar19, (BYTE *)((long)puVar45 + (long)puVar19) == pBVar2))
                goto LAB_00117beb;
              }
            }
            local_100[(long)local_108] = (U32)local_110;
            local_110 = (uint *)(ulong)((U32)local_110 + 2);
            puVar19 = (uint *)0x0;
            puVar25 = (uint *)0x0;
            iVar13 = uVar42 + 9;
            while ((bVar47 = iVar11 != 0, iVar11 = iVar11 + -1, iVar12 = iVar13, bVar47 &&
                   (UVar14 + (UVar14 == 0) <= UVar15))) {
              puVar20 = puVar25;
              if (puVar19 < puVar25) {
                puVar20 = puVar19;
              }
              pBVar41 = pBVar46 + UVar15;
              sVar18 = ZSTD_count((BYTE *)((long)puVar45 + (long)puVar20),
                                  (BYTE *)((long)puVar20 + (long)pBVar41),pBVar2);
              puVar20 = (uint *)(sVar18 + (long)puVar20);
              if (puVar24 < puVar20) {
                iVar12 = UVar15 + (U32)puVar20;
                if (puVar20 <= (uint *)(ulong)(iVar13 - UVar15)) {
                  iVar12 = iVar13;
                }
                pZVar4[uVar44].off = (int)local_110 - UVar15;
                pZVar4[uVar44].len = (U32)puVar20;
                uVar44 = (ulong)((int)uVar44 + 1);
                if (((uint *)0x1000 < puVar20) ||
                   (puVar24 = puVar20, (BYTE *)((long)puVar45 + (long)puVar20) == pBVar2)) break;
              }
              pUVar21 = pUVar32 + (UVar15 & uVar8) * 2;
              if (pBVar41[(long)puVar20] < *(byte *)((long)puVar45 + (long)puVar20)) {
                *local_1a8 = UVar15;
                if (UVar15 <= uVar34) goto LAB_00117a1f;
                pUVar21 = pUVar21 + 1;
                puVar19 = puVar20;
                puVar20 = puVar25;
                local_1a8 = pUVar21;
              }
              else {
                *local_1c0 = UVar15;
                local_1c0 = pUVar21;
                if (UVar15 <= uVar34) goto LAB_00117ba1;
              }
              puVar25 = puVar20;
              iVar13 = iVar12;
              UVar15 = *pUVar21;
            }
            goto LAB_00117bda;
          }
          if (UVar14 != 3) {
            uVar29 = (ulong)(UVar9 == 0);
            uVar39 = (ms->cParams).targetLength;
            if (0xffe < uVar39) {
              uVar39 = 0xfff;
            }
            pBVar46 = (ms->window).base;
            uVar42 = iVar11 - (int)pBVar46;
            local_110 = (uint *)(ulong)uVar42;
            uVar44 = 0;
            local_108 = (U32 *)(ulong)(*puVar45 * -0x61c8864f >>
                                      (-(char)(ms->cParams).hashLog & 0x1fU));
            pUVar32 = ms->chainTable;
            uVar8 = ~(-1 << ((char)(ms->cParams).chainLog - 1U & 0x1f));
            uVar34 = uVar42 - uVar8;
            if (uVar42 < uVar8) {
              uVar34 = 0;
            }
            UVar14 = (ms->window).lowLimit;
            uVar36 = (ulong)((uVar8 & uVar42) * 2);
            local_1a8 = pUVar32 + uVar36;
            local_1c0 = pUVar32 + uVar36 + 1;
            iVar11 = 1 << ((byte)(ms->cParams).searchLog & 0x1f);
            UVar10 = (ms->window).dictLimit;
            uVar40 = (U32)local_f8 - 1;
            local_100 = ms->hashTable;
            UVar15 = local_100[(long)local_108];
            uVar36 = uVar29 + 3;
            local_118 = puVar45 + 1;
            puVar24 = local_e0;
            for (; uVar29 < uVar36; uVar29 = uVar29 + 1) {
              uVar35 = uVar40;
              if (uVar29 != 3) {
                uVar35 = *(uint *)((long)&local_f8 + uVar29 * 4);
              }
              uVar43 = 0;
              if ((uVar35 - 1 < uVar42 - UVar10) &&
                 (*puVar45 == *(uint *)((long)puVar45 - (ulong)uVar35))) {
                sVar18 = ZSTD_count((BYTE *)local_118,(BYTE *)((long)local_118 - (ulong)uVar35),
                                    pBVar2);
                uVar43 = (int)sVar18 + 4;
              }
              puVar19 = (uint *)(ulong)uVar43;
              if (puVar24 < puVar19) {
                pZVar4[uVar44].off = (int)uVar29 - (uint)(UVar9 == 0);
                pZVar4[uVar44].len = uVar43;
                uVar44 = (ulong)((int)uVar44 + 1);
                if ((uVar39 < uVar43) ||
                   (puVar24 = puVar19, (BYTE *)((long)puVar45 + (long)puVar19) == pBVar2))
                goto LAB_00117beb;
              }
            }
            local_100[(long)local_108] = (U32)local_110;
            local_110 = (uint *)(ulong)((U32)local_110 + 2);
            puVar19 = (uint *)0x0;
            puVar25 = (uint *)0x0;
            iVar13 = uVar42 + 9;
            while ((bVar47 = iVar11 != 0, iVar11 = iVar11 + -1, iVar12 = iVar13, bVar47 &&
                   (UVar14 + (UVar14 == 0) <= UVar15))) {
              puVar20 = puVar25;
              if (puVar19 < puVar25) {
                puVar20 = puVar19;
              }
              pBVar41 = pBVar46 + UVar15;
              sVar18 = ZSTD_count((BYTE *)((long)puVar45 + (long)puVar20),
                                  (BYTE *)((long)puVar20 + (long)pBVar41),pBVar2);
              puVar20 = (uint *)(sVar18 + (long)puVar20);
              if (puVar24 < puVar20) {
                iVar12 = UVar15 + (U32)puVar20;
                if (puVar20 <= (uint *)(ulong)(iVar13 - UVar15)) {
                  iVar12 = iVar13;
                }
                pZVar4[uVar44].off = (int)local_110 - UVar15;
                pZVar4[uVar44].len = (U32)puVar20;
                uVar44 = (ulong)((int)uVar44 + 1);
                if (((uint *)0x1000 < puVar20) ||
                   (puVar24 = puVar20, (BYTE *)((long)puVar45 + (long)puVar20) == pBVar2)) break;
              }
              pUVar21 = pUVar32 + (UVar15 & uVar8) * 2;
              if (pBVar41[(long)puVar20] < *(byte *)((long)puVar45 + (long)puVar20)) {
                *local_1a8 = UVar15;
                if (UVar15 <= uVar34) goto LAB_00117a1f;
                pUVar21 = pUVar21 + 1;
                puVar19 = puVar20;
                puVar20 = puVar25;
                local_1a8 = pUVar21;
              }
              else {
                *local_1c0 = UVar15;
                local_1c0 = pUVar21;
                if (UVar15 <= uVar34) goto LAB_00117ba1;
              }
              puVar25 = puVar20;
              iVar13 = iVar12;
              UVar15 = *pUVar21;
            }
            goto LAB_00117bda;
          }
          uVar29 = (ulong)(UVar9 == 0);
          uVar39 = (ms->cParams).targetLength;
          if (0xffe < uVar39) {
            uVar39 = 0xfff;
          }
          pBVar46 = (ms->window).base;
          uVar42 = iVar11 - (int)pBVar46;
          uVar44 = 0;
          local_108 = (U32 *)(ulong)(*puVar45 * -0x61c8864f >>
                                    (-(char)(ms->cParams).hashLog & 0x1fU));
          pUVar32 = ms->chainTable;
          uVar8 = ~(-1 << ((char)(ms->cParams).chainLog - 1U & 0x1f));
          uVar34 = uVar42 - uVar8;
          if (uVar42 < uVar8) {
            uVar34 = 0;
          }
          UVar14 = (ms->window).lowLimit;
          uVar35 = UVar14 + (UVar14 == 0);
          uVar36 = (ulong)((uVar8 & uVar42) * 2);
          local_1a8 = pUVar32 + uVar36;
          local_168 = pUVar32 + uVar36 + 1;
          iVar11 = 1 << ((byte)(ms->cParams).searchLog & 0x1f);
          UVar14 = (ms->window).dictLimit;
          uVar40 = (U32)local_f8 - 1;
          local_100 = ms->hashTable;
          UVar10 = local_100[(long)local_108];
          iVar12 = uVar42 + 9;
          uVar36 = uVar29 + 3;
          local_118 = (uint *)((long)puVar45 + 3);
          local_110 = (uint *)CONCAT44(local_110._4_4_,uVar40);
          puVar24 = local_e0;
          for (; uVar29 < uVar36; uVar29 = uVar29 + 1) {
            uVar43 = uVar40;
            if (uVar29 != 3) {
              uVar43 = *(uint *)((long)&local_f8 + uVar29 * 4);
            }
            puVar19 = (uint *)0x0;
            if ((uVar43 - 1 < uVar42 - UVar14) &&
               (((*(uint *)((long)puVar45 - (ulong)uVar43) ^ *puVar45) & 0xffffff) == 0)) {
              sVar18 = ZSTD_count((BYTE *)local_118,(BYTE *)((long)local_118 - (ulong)uVar43),pBVar2
                                 );
              puVar19 = (uint *)(ulong)((int)sVar18 + 3);
              uVar40 = (uint)local_110;
            }
            if (puVar24 < puVar19) {
              pZVar4[uVar44].off = (int)uVar29 - (uint)(UVar9 == 0);
              pZVar4[uVar44].len = (uint)puVar19;
              uVar44 = (ulong)((int)uVar44 + 1);
              if ((uVar39 < (uint)puVar19) ||
                 (puVar24 = puVar19, (BYTE *)((long)puVar45 + (long)puVar19) == pBVar2))
              goto LAB_00117beb;
            }
          }
          if (((((uint *)0x2 < puVar24) ||
               (UVar14 = ZSTD_insertAndFindFirstIndexHash3(ms,(BYTE *)puVar45), UVar14 < uVar35)) ||
              (0x3ffff < uVar42 - UVar14)) ||
             (puVar19 = (uint *)ZSTD_count((BYTE *)puVar45,pBVar46 + UVar14,pBVar2),
             puVar19 < (uint *)0x3)) {
LAB_00117a3b:
            local_100[(long)local_108] = uVar42;
            puVar19 = (uint *)0x0;
            puVar25 = (uint *)0x0;
            do {
              bVar47 = iVar11 == 0;
              iVar11 = iVar11 + -1;
              local_1c0 = local_168;
              if ((bVar47) || (UVar10 < uVar35)) goto LAB_00117bda;
              puVar20 = puVar25;
              if (puVar19 < puVar25) {
                puVar20 = puVar19;
              }
              sVar18 = ZSTD_count((BYTE *)((long)puVar45 + (long)puVar20),
                                  (BYTE *)((long)puVar20 + (long)(pBVar46 + UVar10)),pBVar2);
              puVar20 = (uint *)(sVar18 + (long)puVar20);
              if (puVar24 < puVar20) {
                iVar13 = UVar10 + (U32)puVar20;
                if (puVar20 <= (uint *)(ulong)(iVar12 - UVar10)) {
                  iVar13 = iVar12;
                }
                iVar12 = iVar13;
                pZVar4[uVar44].off = (uVar42 + 2) - UVar10;
                pZVar4[uVar44].len = (U32)puVar20;
                uVar44 = (ulong)((int)uVar44 + 1);
                if (((uint *)0x1000 < puVar20) ||
                   (puVar24 = puVar20, (BYTE *)((long)puVar45 + (long)puVar20) == pBVar2))
                goto LAB_00117bda;
              }
              pUVar21 = pUVar32 + (UVar10 & uVar8) * 2;
              if ((pBVar46 + UVar10)[(long)puVar20] < *(byte *)((long)puVar45 + (long)puVar20)) {
                *local_1a8 = UVar10;
                if (UVar10 <= uVar34) {
                  local_1a8 = &local_11c;
                  goto LAB_00117bda;
                }
                pUVar21 = pUVar21 + 1;
                puVar19 = puVar20;
                puVar20 = puVar25;
                local_1a8 = pUVar21;
              }
              else {
                *local_168 = UVar10;
                local_168 = pUVar21;
                if (UVar10 <= uVar34) goto LAB_00117ba1;
              }
              UVar10 = *pUVar21;
              puVar25 = puVar20;
            } while( true );
          }
          pZVar4->off = (uVar42 - UVar14) + 2;
          pZVar4->len = (U32)puVar19;
          uVar44 = 1;
          puVar24 = puVar19;
          if (puVar19 <= (uint *)(ulong)uVar39 && (BYTE *)((long)puVar19 + (long)puVar45) != pBVar2)
          goto LAB_00117a3b;
          UVar14 = uVar42 + 1;
          uVar44 = 1;
          goto LAB_00117be3;
        }
        uVar29 = (ulong)(UVar9 == 0);
        uVar39 = (ms->cParams).targetLength;
        if (0xffe < uVar39) {
          uVar39 = 0xfff;
        }
        pBVar46 = (ms->window).base;
        uVar42 = iVar11 - (int)pBVar46;
        uVar44 = 0;
        local_118 = (uint *)((ulong)(*(long *)puVar45 * -0x30e4432340650000) >>
                            (-(char)(ms->cParams).hashLog & 0x3fU));
        pUVar32 = ms->chainTable;
        uVar8 = ~(-1 << ((char)(ms->cParams).chainLog - 1U & 0x1f));
        uVar34 = uVar42 - uVar8;
        if (uVar42 < uVar8) {
          uVar34 = 0;
        }
        UVar14 = (ms->window).lowLimit;
        uVar36 = (ulong)((uVar8 & uVar42) * 2);
        local_198 = pUVar32 + uVar36;
        local_168 = pUVar32 + uVar36 + 1;
        iVar11 = 1 << ((byte)(ms->cParams).searchLog & 0x1f);
        UVar10 = (ms->window).dictLimit;
        uVar40 = (U32)local_f8 - 1;
        local_108 = ms->hashTable;
        UVar15 = local_108[(long)local_118];
        iVar13 = uVar42 + 9;
        uVar36 = uVar29 + 3;
        local_110 = (uint *)CONCAT44(local_110._4_4_,uVar40);
        puVar24 = local_e0;
        for (; uVar29 < uVar36; uVar29 = uVar29 + 1) {
          uVar35 = uVar40;
          if (uVar29 != 3) {
            uVar35 = *(uint *)((long)&local_f8 + uVar29 * 4);
          }
          puVar19 = (uint *)0x0;
          if ((uVar35 - 1 < uVar42 - UVar10) &&
             (*puVar45 == *(uint *)((long)puVar45 - (ulong)uVar35))) {
            sVar18 = ZSTD_count((BYTE *)(puVar45 + 1),(BYTE *)((long)(puVar45 + 1) - (ulong)uVar35),
                                pBVar2);
            puVar19 = (uint *)(ulong)((int)sVar18 + 4);
            uVar40 = (uint)local_110;
          }
          if (puVar24 < puVar19) {
            pZVar4[uVar44].off = (int)uVar29 - (uint)(UVar9 == 0);
            pZVar4[uVar44].len = (uint)puVar19;
            uVar44 = (ulong)((int)uVar44 + 1);
            if ((uVar39 < (uint)puVar19) ||
               (puVar24 = puVar19, (BYTE *)((long)puVar45 + (long)puVar19) == pBVar2))
            goto LAB_00117beb;
          }
        }
        local_108[(long)local_118] = uVar42;
        puVar19 = (uint *)0x0;
        puVar25 = (uint *)0x0;
LAB_00117107:
        bVar47 = iVar11 == 0;
        iVar11 = iVar11 + -1;
        if ((bVar47) || (UVar15 < UVar14 + (UVar14 == 0))) goto LAB_00117a09;
        puVar20 = puVar19;
        if (puVar25 < puVar19) {
          puVar20 = puVar25;
        }
        pBVar41 = pBVar46 + UVar15;
        sVar18 = ZSTD_count((BYTE *)((long)puVar45 + (long)puVar20),pBVar41 + (long)puVar20,pBVar2);
        puVar20 = (uint *)(sVar18 + (long)puVar20);
        if (puVar24 < puVar20) {
          iVar12 = UVar15 + (U32)puVar20;
          if (puVar20 <= (uint *)(ulong)(iVar13 - UVar15)) {
            iVar12 = iVar13;
          }
          pZVar4[uVar44].off = (uVar42 + 2) - UVar15;
          pZVar4[uVar44].len = (U32)puVar20;
          uVar44 = (ulong)((int)uVar44 + 1);
          iVar13 = iVar12;
          if (((uint *)0x1000 < puVar20) ||
             (puVar24 = puVar20, (BYTE *)((long)puVar45 + (long)puVar20) == pBVar2))
          goto LAB_00117a09;
        }
        pUVar21 = pUVar32 + (UVar15 & uVar8) * 2;
        if (*(byte *)((long)puVar45 + (long)puVar20) <= pBVar41[(long)puVar20]) {
          *local_168 = UVar15;
          local_168 = pUVar21;
          puVar19 = puVar20;
          if (UVar15 <= uVar34) {
            local_168 = &local_11c;
            goto LAB_00117a09;
          }
LAB_00117238:
          UVar15 = *pUVar21;
          goto LAB_00117107;
        }
        *local_198 = UVar15;
        if (uVar34 < UVar15) {
          pUVar21 = pUVar21 + 1;
          puVar25 = puVar20;
          local_198 = pUVar21;
          goto LAB_00117238;
        }
        local_198 = &local_11c;
LAB_00117a09:
        *local_168 = 0;
        *local_198 = 0;
        ms->nextToUpdate = iVar13 - 8;
        goto LAB_00117beb;
      }
      goto LAB_00117c05;
    }
    ZSTD_resetSeqStore(ssPtr);
    ppBVar1 = &(ms->window).base;
    *ppBVar1 = *ppBVar1 + -(long)local_b0;
    UVar14 = (ms->window).dictLimit + (int)local_b0;
    (ms->window).dictLimit = UVar14;
    (ms->window).lowLimit = UVar14;
    ms->nextToUpdate = UVar14;
    ms->nextToUpdate3 = UVar14;
    pZVar38 = ms;
    if ((ms->opt).literalCompressionMode != ZSTD_lcm_uncompressed) {
      UVar14 = ZSTD_upscaleStat((ms->opt).litFreq,0xff,(int)ms);
      (ms->opt).litSum = UVar14;
      pZVar38 = extraout_RDX;
    }
    UVar14 = ZSTD_upscaleStat((ms->opt).litLengthFreq,0x23,(int)pZVar38);
    (ms->opt).litLengthSum = UVar14;
    UVar14 = ZSTD_upscaleStat((ms->opt).matchLengthFreq,0x34,bonus);
    (ms->opt).matchLengthSum = UVar14;
    UVar14 = ZSTD_upscaleStat((ms->opt).offCodeFreq,0x1f,bonus_00);
    (ms->opt).offCodeSum = UVar14;
    pBVar46 = (ms->window).base;
    srcSize = (size_t)local_b0;
  }
  uVar39 = (ms->window).dictLimit;
  uVar8 = (ms->cParams).targetLength;
  if (0xffe < uVar8) {
    uVar8 = 0xfff;
  }
  local_d8 = CONCAT44(local_d8._4_4_,uVar8);
  local_b8 = &ms->opt;
  uVar8 = (ms->cParams).minMatch;
  pBVar2 = (BYTE *)((long)src + srcSize);
  pZVar5 = (ms->opt).priceTable;
  pZVar4 = (ms->opt).matchTable;
  ms->nextToUpdate3 = ms->nextToUpdate;
  local_110 = (uint *)((long)((long)src + -8) + srcSize);
  uVar8 = (uint)(uVar8 == 3);
  local_48 = (ulong)((int)local_48 - uVar8);
  ZSTD_rescaleFreqs(local_b8,(BYTE *)src,srcSize,2);
  puVar45 = (uint *)((ulong)(pBVar46 + uVar39 == (BYTE *)src) + (long)src);
  local_a0 = (ulong)(uVar8 ^ 3);
  local_70 = pZVar5 + 1;
  local_40 = pZVar5->rep;
  local_a8 = (uint *)src;
LAB_00119656:
  if (local_110 <= puVar45) {
    return (long)pBVar2 - (long)src;
  }
  pBVar46 = (ms->window).base;
  uVar29 = (ulong)ms->nextToUpdate;
  if (pBVar46 + uVar29 <= puVar45) {
    iVar11 = (int)puVar45;
    local_160._0_4_ = iVar11 - (int)src;
    UVar14 = (ms->cParams).minMatch;
    uVar39 = iVar11 - (int)pBVar46;
    for (; pUVar32 = local_98, (uint)uVar29 < uVar39; uVar29 = (ulong)((uint)uVar29 + UVar9)) {
      UVar9 = ZSTD_insertBt1(ms,pBVar46 + uVar29,pBVar2,UVar14,0);
    }
    ms->nextToUpdate = uVar39;
    if (1 < UVar14 - 6) {
      if (UVar14 == 5) {
        uVar29 = (ulong)((U32)local_160 == 0);
        uVar39 = (ms->cParams).targetLength;
        if (0xffe < uVar39) {
          uVar39 = 0xfff;
        }
        pBVar46 = (ms->window).base;
        uVar42 = iVar11 - (int)pBVar46;
        local_118 = (uint *)((ulong)(*(long *)puVar45 * -0x30e4432345000000) >>
                            (-(char)(ms->cParams).hashLog & 0x3fU));
        uVar44 = 0;
        pUVar21 = ms->chainTable;
        uVar8 = ~(-1 << ((char)(ms->cParams).chainLog - 1U & 0x1f));
        uVar34 = uVar42 - uVar8;
        if (uVar42 < uVar8) {
          uVar34 = 0;
        }
        UVar14 = (ms->window).lowLimit;
        uVar36 = (ulong)((uVar8 & uVar42) * 2);
        local_198 = pUVar21 + uVar36;
        local_1b8 = pUVar21 + uVar36 + 1;
        UVar9 = (ms->window).dictLimit;
        iVar13 = 1 << ((byte)(ms->cParams).searchLog & 0x1f);
        local_e0 = ms->hashTable;
        uVar40 = local_e0[(long)local_118];
        iVar11 = uVar42 + 9;
        uVar36 = uVar29 + 3;
        local_d0 = (uint *)CONCAT44(local_d0._4_4_,uVar39);
        uVar31 = local_a0;
        for (; uVar29 < uVar36; uVar29 = uVar29 + 1) {
          if (uVar29 == 3) {
            uVar35 = *pUVar32 - 1;
          }
          else {
            uVar35 = pUVar32[uVar29];
          }
          uVar33 = 0;
          if ((uVar35 - 1 < uVar42 - UVar9) &&
             (*puVar45 == *(uint *)((long)puVar45 - (ulong)uVar35))) {
            sVar18 = ZSTD_count((BYTE *)(puVar45 + 1),(BYTE *)((long)(puVar45 + 1) - (ulong)uVar35),
                                pBVar2);
            uVar33 = (ulong)((int)sVar18 + 4);
            uVar39 = (uint)local_d0;
          }
          if (uVar31 < uVar33) {
            pZVar4[uVar44].off = (int)uVar29 - (uint)((U32)local_160 == 0);
            pZVar4[uVar44].len = (uint)uVar33;
            uVar44 = (ulong)((int)uVar44 + 1);
            if ((uVar39 < (uint)uVar33) ||
               (uVar31 = uVar33, (BYTE *)((long)puVar45 + uVar33) == pBVar2)) goto LAB_0011a5e9;
          }
        }
        local_e0[(long)local_118] = uVar42;
        uVar29 = 0;
        uVar36 = 0;
        while ((bVar47 = iVar13 != 0, iVar13 = iVar13 + -1, local_138 = local_198, bVar47 &&
               (UVar14 + (UVar14 == 0) <= uVar40))) {
          uVar33 = uVar36;
          if (uVar29 < uVar36) {
            uVar33 = uVar29;
          }
          sVar18 = ZSTD_count((BYTE *)((long)puVar45 + uVar33),pBVar46 + uVar33 + uVar40,pBVar2);
          uVar33 = sVar18 + uVar33;
          if (uVar31 < uVar33) {
            iVar12 = uVar40 + (U32)uVar33;
            if (uVar33 <= iVar11 - uVar40) {
              iVar12 = iVar11;
            }
            pZVar4[uVar44].off = (uVar42 + 2) - uVar40;
            pZVar4[uVar44].len = (U32)uVar33;
            uVar44 = (ulong)((int)uVar44 + 1);
            iVar11 = iVar12;
            if ((0x1000 < uVar33) || (uVar31 = uVar33, (BYTE *)((long)puVar45 + uVar33) == pBVar2))
            break;
          }
          pUVar32 = pUVar21 + (uVar40 & uVar8) * 2;
          if (pBVar46[uVar33 + uVar40] < *(byte *)((long)puVar45 + uVar33)) {
            *local_198 = uVar40;
            if (uVar40 <= uVar34) goto LAB_0011a5a2;
            pUVar32 = pUVar32 + 1;
            uVar29 = uVar33;
            uVar33 = uVar36;
            local_198 = pUVar32;
          }
          else {
            *local_1b8 = uVar40;
            local_1b8 = pUVar32;
            if (uVar40 <= uVar34) goto LAB_0011a418;
          }
          uVar36 = uVar33;
          uVar40 = *pUVar32;
        }
        goto LAB_0011a5d8;
      }
      if (UVar14 != 3) {
        uVar29 = (ulong)((U32)local_160 == 0);
        uVar39 = (ms->cParams).targetLength;
        if (0xffe < uVar39) {
          uVar39 = 0xfff;
        }
        pBVar46 = (ms->window).base;
        uVar42 = iVar11 - (int)pBVar46;
        local_118 = (uint *)(ulong)(*puVar45 * -0x61c8864f >> (-(char)(ms->cParams).hashLog & 0x1fU)
                                   );
        uVar44 = 0;
        pUVar21 = ms->chainTable;
        uVar8 = ~(-1 << ((char)(ms->cParams).chainLog - 1U & 0x1f));
        uVar34 = uVar42 - uVar8;
        if (uVar42 < uVar8) {
          uVar34 = 0;
        }
        UVar14 = (ms->window).lowLimit;
        uVar36 = (ulong)((uVar8 & uVar42) * 2);
        local_198 = pUVar21 + uVar36;
        local_1b8 = pUVar21 + uVar36 + 1;
        uVar35 = uVar42 - (ms->window).dictLimit;
        iVar13 = 1 << ((byte)(ms->cParams).searchLog & 0x1f);
        local_e0 = ms->hashTable;
        uVar40 = local_e0[(long)local_118];
        iVar11 = uVar42 + 9;
        uVar36 = uVar29 + 3;
        local_d0 = (uint *)CONCAT44(local_d0._4_4_,uVar35);
        uVar31 = local_a0;
        for (; uVar29 < uVar36; uVar29 = uVar29 + 1) {
          if (uVar29 == 3) {
            uVar43 = *pUVar32 - 1;
          }
          else {
            uVar43 = pUVar32[uVar29];
          }
          uVar33 = 0;
          if ((uVar43 - 1 < uVar35) && (*puVar45 == *(uint *)((long)puVar45 - (ulong)uVar43))) {
            sVar18 = ZSTD_count((BYTE *)(puVar45 + 1),(BYTE *)((long)(puVar45 + 1) - (ulong)uVar43),
                                pBVar2);
            uVar33 = (ulong)((int)sVar18 + 4);
            uVar35 = (uint)local_d0;
          }
          if (uVar31 < uVar33) {
            pZVar4[uVar44].off = (int)uVar29 - (uint)((U32)local_160 == 0);
            pZVar4[uVar44].len = (uint)uVar33;
            uVar44 = (ulong)((int)uVar44 + 1);
            if ((uVar39 < (uint)uVar33) ||
               (uVar31 = uVar33, (BYTE *)((long)puVar45 + uVar33) == pBVar2)) goto LAB_0011a5e9;
          }
        }
        local_e0[(long)local_118] = uVar42;
        uVar29 = 0;
        uVar36 = 0;
        while ((bVar47 = iVar13 != 0, iVar13 = iVar13 + -1, local_138 = local_198, bVar47 &&
               (UVar14 + (UVar14 == 0) <= uVar40))) {
          uVar33 = uVar36;
          if (uVar29 < uVar36) {
            uVar33 = uVar29;
          }
          sVar18 = ZSTD_count((BYTE *)((long)puVar45 + uVar33),pBVar46 + uVar33 + uVar40,pBVar2);
          uVar33 = sVar18 + uVar33;
          if (uVar31 < uVar33) {
            iVar12 = uVar40 + (U32)uVar33;
            if (uVar33 <= iVar11 - uVar40) {
              iVar12 = iVar11;
            }
            pZVar4[uVar44].off = (uVar42 + 2) - uVar40;
            pZVar4[uVar44].len = (U32)uVar33;
            uVar44 = (ulong)((int)uVar44 + 1);
            iVar11 = iVar12;
            if ((0x1000 < uVar33) || (uVar31 = uVar33, (BYTE *)((long)puVar45 + uVar33) == pBVar2))
            break;
          }
          pUVar32 = pUVar21 + (uVar40 & uVar8) * 2;
          if (pBVar46[uVar33 + uVar40] < *(byte *)((long)puVar45 + uVar33)) {
            *local_198 = uVar40;
            if (uVar40 <= uVar34) goto LAB_0011a5a2;
            pUVar32 = pUVar32 + 1;
            uVar29 = uVar33;
            uVar33 = uVar36;
            local_198 = pUVar32;
          }
          else {
            *local_1b8 = uVar40;
            local_1b8 = pUVar32;
            if (uVar40 <= uVar34) goto LAB_0011a418;
          }
          uVar36 = uVar33;
          uVar40 = *pUVar32;
        }
        goto LAB_0011a5d8;
      }
      uVar29 = (ulong)((U32)local_160 == 0);
      uVar39 = (ms->cParams).targetLength;
      if (0xffe < uVar39) {
        uVar39 = 0xfff;
      }
      pBVar46 = (ms->window).base;
      uVar42 = iVar11 - (int)pBVar46;
      local_d0 = (uint *)(ulong)(*puVar45 * -0x61c8864f >> (-(char)(ms->cParams).hashLog & 0x1fU));
      uVar44 = 0;
      pUVar32 = ms->chainTable;
      uVar8 = ~(-1 << ((char)(ms->cParams).chainLog - 1U & 0x1f));
      uVar34 = uVar42 - uVar8;
      if (uVar42 < uVar8) {
        uVar34 = 0;
      }
      UVar14 = (ms->window).lowLimit;
      uVar35 = UVar14 + (UVar14 == 0);
      uVar36 = (ulong)((uVar8 & uVar42) * 2);
      local_138 = pUVar32 + uVar36;
      local_1b8 = pUVar32 + uVar36 + 1;
      UVar14 = (ms->window).dictLimit;
      iVar13 = 1 << ((byte)(ms->cParams).searchLog & 0x1f);
      local_118 = ms->hashTable;
      uVar40 = local_118[(long)local_d0];
      iVar11 = uVar42 + 9;
      uVar36 = uVar29 + 3;
      uVar31 = local_a0;
      for (; uVar29 < uVar36; uVar29 = uVar29 + 1) {
        if (uVar29 == 3) {
          uVar43 = *local_98 - 1;
        }
        else {
          uVar43 = local_98[uVar29];
        }
        uVar33 = 0;
        if ((uVar43 - 1 < uVar42 - UVar14) &&
           (((*(uint *)((long)puVar45 - (ulong)uVar43) ^ *puVar45) & 0xffffff) == 0)) {
          sVar18 = ZSTD_count((BYTE *)((long)puVar45 + 3),
                              (BYTE *)((long)puVar45 + 3) + -(ulong)uVar43,pBVar2);
          uVar33 = (ulong)((int)sVar18 + 3);
        }
        if (uVar31 < uVar33) {
          pZVar4[uVar44].off = (int)uVar29 - (uint)((U32)local_160 == 0);
          pZVar4[uVar44].len = (uint)uVar33;
          uVar44 = (ulong)((int)uVar44 + 1);
          if ((uVar39 < (uint)uVar33) ||
             (uVar31 = uVar33, (BYTE *)((long)puVar45 + uVar33) == pBVar2)) goto LAB_0011a5e9;
        }
      }
      if ((((2 < uVar31) ||
           (UVar14 = ZSTD_insertAndFindFirstIndexHash3(ms,(BYTE *)puVar45), UVar14 < uVar35)) ||
          (0x3ffff < uVar42 - UVar14)) ||
         (sVar18 = ZSTD_count((BYTE *)puVar45,pBVar46 + UVar14,pBVar2), sVar18 < 3)) {
LAB_0011a438:
        local_118[(long)local_d0] = uVar42;
        uVar29 = 0;
        uVar36 = 0;
        do {
          bVar47 = iVar13 == 0;
          iVar13 = iVar13 + -1;
          if ((bVar47) || (uVar40 < uVar35)) goto LAB_0011a5d8;
          uVar33 = uVar36;
          if (uVar29 < uVar36) {
            uVar33 = uVar29;
          }
          sVar18 = ZSTD_count((BYTE *)((long)puVar45 + uVar33),pBVar46 + uVar33 + uVar40,pBVar2);
          uVar33 = sVar18 + uVar33;
          if (uVar31 < uVar33) {
            iVar12 = uVar40 + (U32)uVar33;
            if (uVar33 <= iVar11 - uVar40) {
              iVar12 = iVar11;
            }
            pZVar4[uVar44].off = (uVar42 + 2) - uVar40;
            pZVar4[uVar44].len = (U32)uVar33;
            uVar44 = (ulong)((int)uVar44 + 1);
            iVar11 = iVar12;
            if ((0x1000 < uVar33) || (uVar31 = uVar33, (BYTE *)((long)puVar45 + uVar33) == pBVar2))
            goto LAB_0011a5d8;
          }
          pUVar21 = pUVar32 + (uVar40 & uVar8) * 2;
          if (pBVar46[uVar33 + uVar40] < *(byte *)((long)puVar45 + uVar33)) {
            *local_138 = uVar40;
            if (uVar40 <= uVar34) goto LAB_0011a5a2;
            pUVar21 = pUVar21 + 1;
            uVar29 = uVar33;
            uVar33 = uVar36;
            local_138 = pUVar21;
          }
          else {
            *local_1b8 = uVar40;
            local_1b8 = pUVar21;
            if (uVar40 <= uVar34) {
              local_1b8 = (U32 *)&local_f8;
              goto LAB_0011a5d8;
            }
          }
          uVar40 = *pUVar21;
          uVar36 = uVar33;
        } while( true );
      }
      pZVar4->off = (uVar42 - UVar14) + 2;
      pZVar4->len = (U32)sVar18;
      uVar44 = 1;
      uVar31 = sVar18;
      if (sVar18 <= uVar39 && (BYTE *)(sVar18 + (long)puVar45) != pBVar2) goto LAB_0011a438;
      UVar14 = uVar42 + 1;
      uVar44 = 1;
      goto LAB_0011a5e1;
    }
    uVar29 = (ulong)((U32)local_160 == 0);
    uVar39 = (ms->cParams).targetLength;
    if (0xffe < uVar39) {
      uVar39 = 0xfff;
    }
    pBVar46 = (ms->window).base;
    uVar42 = iVar11 - (int)pBVar46;
    uVar36 = (ulong)(*(long *)puVar45 * -0x30e4432340650000) >>
             (-(char)(ms->cParams).hashLog & 0x3fU);
    uVar44 = 0;
    pUVar32 = ms->chainTable;
    uVar8 = ~(-1 << ((char)(ms->cParams).chainLog - 1U & 0x1f));
    uVar34 = uVar42 - uVar8;
    if (uVar42 < uVar8) {
      uVar34 = 0;
    }
    UVar14 = (ms->window).lowLimit;
    uVar31 = (ulong)((uVar8 & uVar42) * 2);
    local_198 = pUVar32 + uVar31;
    local_1b8 = pUVar32 + uVar31 + 1;
    UVar9 = (ms->window).dictLimit;
    iVar11 = 1 << ((byte)(ms->cParams).searchLog & 0x1f);
    local_d0 = ms->hashTable;
    uVar40 = local_d0[uVar36];
    iVar13 = uVar42 + 9;
    uVar31 = uVar29 + 3;
    uVar33 = local_a0;
    for (; uVar29 < uVar31; uVar29 = uVar29 + 1) {
      if (uVar29 == 3) {
        uVar35 = *local_98 - 1;
      }
      else {
        uVar35 = local_98[uVar29];
      }
      uVar30 = 0;
      if ((uVar35 - 1 < uVar42 - UVar9) && (*puVar45 == *(uint *)((long)puVar45 - (ulong)uVar35))) {
        sVar18 = ZSTD_count((BYTE *)(puVar45 + 1),(BYTE *)((long)(puVar45 + 1) - (ulong)uVar35),
                            pBVar2);
        uVar30 = (ulong)((int)sVar18 + 4);
      }
      if (uVar33 < uVar30) {
        pZVar4[uVar44].off = (int)uVar29 - (uint)((U32)local_160 == 0);
        pZVar4[uVar44].len = (uint)uVar30;
        uVar44 = (ulong)((int)uVar44 + 1);
        if ((uVar39 < (uint)uVar30) || (uVar33 = uVar30, (BYTE *)((long)puVar45 + uVar30) == pBVar2)
           ) goto LAB_0011a5e9;
      }
    }
    local_d0[uVar36] = uVar42;
    uVar29 = 0;
    uVar36 = 0;
LAB_00119ade:
    bVar47 = iVar11 == 0;
    iVar11 = iVar11 + -1;
    if ((bVar47) || (uVar40 < UVar14 + (UVar14 == 0))) goto LAB_0011a3fa;
    uVar31 = uVar36;
    if (uVar29 < uVar36) {
      uVar31 = uVar29;
    }
    sVar18 = ZSTD_count((BYTE *)((long)puVar45 + uVar31),pBVar46 + uVar31 + uVar40,pBVar2);
    uVar31 = sVar18 + uVar31;
    if (uVar33 < uVar31) {
      iVar12 = uVar40 + (U32)uVar31;
      if (uVar31 <= iVar13 - uVar40) {
        iVar12 = iVar13;
      }
      pZVar4[uVar44].off = (uVar42 + 2) - uVar40;
      pZVar4[uVar44].len = (U32)uVar31;
      uVar44 = (ulong)((int)uVar44 + 1);
      iVar13 = iVar12;
      if ((0x1000 < uVar31) || (uVar33 = uVar31, (BYTE *)((long)puVar45 + uVar31) == pBVar2))
      goto LAB_0011a3fa;
    }
    pUVar21 = pUVar32 + (uVar40 & uVar8) * 2;
    if (*(byte *)((long)puVar45 + uVar31) <= pBVar46[uVar31 + uVar40]) {
      *local_1b8 = uVar40;
      local_1b8 = pUVar21;
      if (uVar40 <= uVar34) {
        local_1b8 = (U32 *)&local_f8;
        goto LAB_0011a3fa;
      }
LAB_00119c06:
      uVar40 = *pUVar21;
      uVar36 = uVar31;
      goto LAB_00119ade;
    }
    *local_198 = uVar40;
    if (uVar34 < uVar40) {
      pUVar21 = pUVar21 + 1;
      uVar29 = uVar31;
      uVar31 = uVar36;
      local_198 = pUVar21;
      goto LAB_00119c06;
    }
    local_198 = (U32 *)&local_f8;
LAB_0011a3fa:
    *local_1b8 = 0;
    *local_198 = 0;
    ms->nextToUpdate = iVar13 - 8;
    goto LAB_0011a5e9;
  }
  goto LAB_0011a5fb;
LAB_00117a1f:
  local_1a8 = &local_11c;
  goto LAB_00117bda;
LAB_00117ba1:
  local_1c0 = &local_11c;
LAB_00117bda:
  *local_1c0 = 0;
  *local_1a8 = 0;
  UVar14 = iVar12 - 8;
LAB_00117be3:
  ms->nextToUpdate = UVar14;
LAB_00117beb:
  iVar11 = local_64;
  poVar7 = local_b8;
  ssPtr = local_50;
  if ((int)uVar44 == 0) {
LAB_00117c05:
    puVar45 = (uint *)((long)puVar45 + 1);
  }
  else {
    for (lVar22 = 0; lVar22 != 3; lVar22 = lVar22 + 1) {
      pZVar5->rep[lVar22] = *(U32 *)((long)&local_f8 + lVar22 * 4);
    }
    pZVar5->mlen = 0;
    pZVar5->litlen = UVar9;
    iVar13 = ZSTD_literalsContribution((BYTE *)local_148,UVar9,local_b8,2);
    pZVar5->price = iVar13;
    uVar8 = (int)uVar44 - 1;
    uVar39 = pZVar4[uVar8].len;
    if ((uint)local_90 < uVar39) {
      UVar10 = pZVar4[uVar8].off;
      uVar29 = 0;
      local_64 = iVar11;
    }
    else {
      UVar14 = ZSTD_litLengthPrice(0,poVar7,2);
      pZVar23 = local_70;
      for (uVar29 = 1; uVar29 < local_a0; uVar29 = uVar29 + 1) {
        pZVar23->price = 0x40000000;
        pZVar23 = pZVar23 + 1;
      }
      uVar36 = 0;
      while( true ) {
        uVar31 = 1;
        if (uVar36 == uVar44) break;
        UVar10 = pZVar4[uVar36].off;
        uVar39 = pZVar4[uVar36].len;
        rVar48 = ZSTD_updateRep((U32 *)&local_f8,UVar10,(uint)(UVar9 == 0));
        uVar8 = 0x1f;
        if (UVar10 + 1 != 0) {
          for (; UVar10 + 1 >> uVar8 == 0; uVar8 = uVar8 - 1) {
          }
        }
        uVar34 = (int)uVar29 * 0x100 - 0x200;
        while (uVar42 = (uint)uVar29, uVar42 <= uVar39) {
          if ((ms->opt).priceType == zop_predef) {
            iVar11 = 0x1f;
            if (uVar42 - 2 != 0) {
              for (; uVar42 - 2 >> iVar11 == 0; iVar11 = iVar11 + -1) {
              }
            }
            iVar11 = (iVar11 + uVar8) * 0x100 + (uVar34 >> ((byte)iVar11 & 0x1f)) + 0x1000;
          }
          else {
            uVar35 = uVar42 - 3;
            uVar40 = (ms->opt).offCodeFreq[uVar8] + 1;
            iVar11 = 0x1f;
            if (uVar40 != 0) {
              for (; uVar40 >> iVar11 == 0; iVar11 = iVar11 + -1) {
              }
            }
            if (uVar35 < 0x80) {
              uVar35 = (uint)(byte)(&ZSTD_MLcode_ML_Code)[uVar35];
            }
            else {
              uVar43 = 0x1f;
              if (uVar35 != 0) {
                for (; uVar35 >> uVar43 == 0; uVar43 = uVar43 - 1) {
                }
              }
              uVar35 = (uVar43 ^ 0xffffffe0) + 0x44;
            }
            uVar43 = (ms->opt).matchLengthFreq[uVar35] + 1;
            iVar12 = 0x1f;
            if (uVar43 != 0) {
              for (; uVar43 >> iVar12 == 0; iVar12 = iVar12 + -1) {
              }
            }
            iVar11 = (((ms->opt).offCodeSumBasePrice + (ms->opt).matchLengthSumBasePrice) -
                     ((uVar40 * 0x100 >> ((byte)iVar11 & 0x1f)) +
                     (uVar43 * 0x100 >> ((byte)iVar12 & 0x1f)))) +
                     ((ML_bits[uVar35] + uVar8) - (iVar11 + iVar12)) * 0x100 + 0x33;
          }
          uVar29 = uVar29 & 0xffffffff;
          pZVar5[uVar29].mlen = uVar42;
          pZVar5[uVar29].off = UVar10;
          pZVar5[uVar29].litlen = UVar9;
          pZVar5[uVar29].price = iVar11 + UVar14 + iVar13;
          *(long *)pZVar5[uVar29].rep = rVar48.rep._0_8_;
          pZVar5[uVar29].rep[2] = rVar48.rep[2];
          uVar34 = uVar34 + 0x100;
          uVar29 = (ulong)(uVar42 + 1);
        }
        uVar36 = uVar36 + 1;
      }
      uVar29 = (ulong)((int)uVar29 - 1);
LAB_00117e5a:
      poVar7 = local_b8;
      uVar8 = (uint)uVar31;
      uVar34 = (uint)uVar29;
      if (uVar8 <= uVar34) {
        pZVar23 = pZVar5 + (uVar8 - 1);
        UVar14 = 1;
        if (pZVar5[uVar8 - 1].mlen == 0) {
          UVar14 = pZVar23->litlen + 1;
        }
        puVar24 = (uint *)((long)puVar45 + uVar31);
        iVar11 = pZVar23->price;
        UVar9 = ZSTD_rawLiteralsCost((BYTE *)((long)puVar24 + -1),1,local_b8,2);
        UVar10 = ZSTD_litLengthPrice(UVar14,poVar7,2);
        UVar15 = ZSTD_litLengthPrice(UVar14 - 1,poVar7,2);
        iVar13 = (UVar10 + UVar9 + iVar11) - UVar15;
        pZVar3 = pZVar5 + uVar31;
        iVar11 = pZVar5[uVar31].price;
        if (iVar13 <= pZVar5[uVar31].price) {
          pZVar3->off = 0;
          pZVar3->mlen = 0;
          pZVar3->litlen = UVar14;
          pZVar3->price = iVar13;
          *(undefined8 *)pZVar3->rep = *(undefined8 *)pZVar23->rep;
          pZVar3->rep[2] = pZVar23->rep[2];
          iVar11 = iVar13;
        }
        if (local_d0 < puVar24) goto LAB_001192ad;
        if (uVar8 != uVar34) {
          UVar14 = pZVar3->mlen;
          UVar9 = 0;
          if (UVar14 == 0) {
            UVar9 = pZVar3->litlen;
          }
          local_40 = (U32 *)(uVar31 * 0x1c);
          UVar10 = ZSTD_litLengthPrice(0,local_b8,2);
          pUVar32 = local_38;
          pBVar46 = (ms->window).base;
          uVar44 = (ulong)ms->nextToUpdate;
          if (puVar24 < pBVar46 + uVar44) goto LAB_001192ad;
          UVar15 = (ms->cParams).minMatch;
          iVar13 = (int)puVar24;
          uVar39 = iVar13 - (int)pBVar46;
          for (; (uint)uVar44 < uVar39; uVar44 = (ulong)((uint)uVar44 + UVar16)) {
            UVar16 = ZSTD_insertBt1(ms,pBVar46 + uVar44,pBVar2,UVar15,0);
          }
          ms->nextToUpdate = uVar39;
          if (1 < UVar15 - 6) {
            if (UVar15 == 5) {
              uVar44 = (ulong)(uint)(UVar14 != 0);
              uVar39 = (ms->cParams).targetLength;
              if (0xffe < uVar39) {
                uVar39 = 0xfff;
              }
              local_108 = (U32 *)(ms->window).base;
              uVar42 = iVar13 - (int)local_108;
              local_78 = (ulong)(*(long *)puVar24 * -0x30e4432345000000) >>
                         (-(char)(ms->cParams).hashLog & 0x3fU);
              uVar36 = 0;
              local_e8 = ms->chainTable;
              uVar34 = ~(-1 << ((char)(ms->cParams).chainLog - 1U & 0x1f));
              iVar13 = uVar42 - uVar34;
              if (uVar42 < uVar34) {
                iVar13 = 0;
              }
              local_c8 = CONCAT44(local_c8._4_4_,iVar13);
              UVar15 = (ms->window).lowLimit;
              local_118 = (uint *)CONCAT44(local_118._4_4_,UVar15 + (UVar15 == 0));
              local_100 = (U32 *)CONCAT44(local_100._4_4_,uVar34);
              uVar33 = (ulong)((uVar34 & uVar42) * 2);
              local_178 = local_e8 + uVar33;
              local_170 = local_e8 + uVar33 + 1;
              UVar15 = (ms->window).dictLimit;
              iVar12 = 1 << ((byte)(ms->cParams).searchLog & 0x1f);
              local_80 = ms->hashTable;
              uVar34 = ms->hashTable[local_78];
              local_d8 = (ulong)uVar42;
              iVar13 = uVar42 + 9;
              uVar33 = uVar44 + 3;
              local_c0 = puVar24 + 1;
              local_88 = CONCAT44(local_88._4_4_,uVar39);
              puVar19 = local_e0;
              for (; uVar44 < uVar33; uVar44 = uVar44 + 1) {
                if (uVar44 == 3) {
                  uVar40 = pZVar3->rep[0] - 1;
                }
                else {
                  uVar40 = pUVar32[uVar31 * 7 + uVar44];
                }
                uVar35 = 0;
                if ((uVar40 - 1 < uVar42 - UVar15) &&
                   (uVar35 = 0, *puVar24 == *(uint *)((long)puVar24 - (ulong)uVar40))) {
                  local_110 = puVar19;
                  sVar18 = ZSTD_count((BYTE *)local_c0,(BYTE *)((long)local_c0 - (ulong)uVar40),
                                      pBVar2);
                  uVar35 = (int)sVar18 + 4;
                  puVar19 = local_110;
                  uVar39 = (uint)local_88;
                }
                puVar25 = (uint *)(ulong)uVar35;
                if (puVar19 < puVar25) {
                  pZVar4[uVar36].off = (int)uVar44 - (uint)(UVar14 != 0);
                  pZVar4[uVar36].len = uVar35;
                  uVar36 = (ulong)((int)uVar36 + 1);
                  if ((uVar39 < uVar35) ||
                     (puVar19 = puVar25, (BYTE *)((long)puVar24 + (long)puVar25) == pBVar2))
                  goto LAB_001190b2;
                }
              }
              local_80[local_78] = (U32)local_d8;
              local_d8 = (ulong)((U32)local_d8 + 2);
              puVar25 = (uint *)0x0;
              puVar20 = (uint *)0x0;
              while( true ) {
                bVar47 = iVar12 == 0;
                iVar12 = iVar12 + -1;
                iVar17 = iVar13;
                if ((bVar47) || (uVar34 < (uint)local_118)) break;
                puVar26 = puVar25;
                if (puVar20 < puVar25) {
                  puVar26 = puVar20;
                }
                lVar22 = (ulong)uVar34 + (long)local_108;
                sVar18 = ZSTD_count((BYTE *)((long)puVar24 + (long)puVar26),
                                    (BYTE *)(lVar22 + (long)puVar26),pBVar2);
                puVar26 = (uint *)(sVar18 + (long)puVar26);
                if (puVar19 < puVar26) {
                  iVar17 = uVar34 + (U32)puVar26;
                  if (puVar26 <= (uint *)(ulong)(iVar13 - uVar34)) {
                    iVar17 = iVar13;
                  }
                  pZVar4[uVar36].off = (int)local_d8 - uVar34;
                  pZVar4[uVar36].len = (U32)puVar26;
                  uVar36 = (ulong)((int)uVar36 + 1);
                  if (((uint *)0x1000 < puVar26) ||
                     (puVar19 = puVar26, iVar13 = iVar17,
                     (BYTE *)((long)puVar24 + (long)puVar26) == pBVar2)) break;
                }
                puVar27 = local_e8 + (uVar34 & (uint)local_100) * 2;
                if (*(byte *)(lVar22 + (long)puVar26) < *(byte *)((long)puVar24 + (long)puVar26)) {
                  *local_178 = uVar34;
                  if (uVar34 <= (uint)local_c8) goto LAB_00118e7f;
                  puVar27 = puVar27 + 1;
                  puVar20 = puVar26;
                  local_178 = puVar27;
                }
                else {
                  *local_170 = uVar34;
                  local_170 = puVar27;
                  puVar25 = puVar26;
                  if (uVar34 <= (uint)local_c8) goto LAB_00118e6c;
                }
                uVar34 = *puVar27;
              }
            }
            else {
              if (UVar15 == 3) {
                uVar44 = (ulong)(uint)(UVar14 != 0);
                uVar39 = (ms->cParams).targetLength;
                if (0xffe < uVar39) {
                  uVar39 = 0xfff;
                }
                pBVar46 = (ms->window).base;
                uVar42 = iVar13 - (int)pBVar46;
                local_78 = (ulong)(*puVar24 * -0x61c8864f >> (-(char)(ms->cParams).hashLog & 0x1fU))
                ;
                uVar36 = 0;
                local_108 = ms->chainTable;
                uVar34 = ~(-1 << ((char)(ms->cParams).chainLog - 1U & 0x1f));
                iVar13 = uVar42 - uVar34;
                if (uVar42 < uVar34) {
                  iVar13 = 0;
                }
                local_100 = (U32 *)CONCAT44(local_100._4_4_,iVar13);
                UVar15 = (ms->window).lowLimit;
                uVar40 = UVar15 + (UVar15 == 0);
                local_118 = (uint *)CONCAT44(local_118._4_4_,uVar34);
                uVar33 = (ulong)((uVar34 & uVar42) * 2);
                local_110 = local_108 + uVar33;
                local_188 = local_108 + uVar33 + 1;
                UVar15 = (ms->window).dictLimit;
                iVar12 = 1 << ((byte)(ms->cParams).searchLog & 0x1f);
                uVar37 = (ulong)-(uint)(UVar14 != 0);
                local_80 = ms->hashTable;
                uVar30 = (ulong)ms->hashTable[local_78];
                local_c8 = (ulong)uVar42;
                iVar13 = uVar42 + 9;
                uVar33 = uVar44 + 3;
                local_c0 = (uint *)((long)puVar24 + 3);
                local_d8 = uVar30;
                local_88 = uVar37;
                puVar19 = local_e0;
                for (; uVar44 < uVar33; uVar44 = uVar44 + 1) {
                  if (uVar44 == 3) {
                    uVar34 = pZVar3->rep[0] - 1;
                  }
                  else {
                    uVar34 = pUVar32[uVar31 * 7 + uVar44];
                  }
                  uVar35 = 0;
                  if ((uVar34 - 1 < uVar42 - UVar15) &&
                     (uVar35 = 0,
                     ((*(uint *)((long)puVar24 - (ulong)uVar34) ^ *puVar24) & 0xffffff) == 0)) {
                    local_e8 = puVar19;
                    sVar18 = ZSTD_count((BYTE *)local_c0,(BYTE *)((long)local_c0 - (ulong)uVar34),
                                        pBVar2);
                    uVar35 = (int)sVar18 + 3;
                    uVar30 = local_d8;
                    puVar19 = local_e8;
                    uVar37 = local_88;
                  }
                  puVar25 = (uint *)(ulong)uVar35;
                  if (puVar19 < puVar25) {
                    pZVar4[uVar36].off = (int)uVar37 + (int)uVar44;
                    pZVar4[uVar36].len = uVar35;
                    uVar36 = (ulong)((int)uVar36 + 1);
                    if ((uVar39 < uVar35) ||
                       (puVar19 = puVar25, (BYTE *)((long)puVar24 + (long)puVar25) == pBVar2))
                    goto LAB_001190b2;
                  }
                }
                if ((((puVar19 < (uint *)0x3) &&
                     (UVar15 = ZSTD_insertAndFindFirstIndexHash3(ms,(BYTE *)puVar24),
                     uVar30 = local_d8, uVar40 <= UVar15)) &&
                    (uVar34 = (int)local_c8 - UVar15, uVar34 < 0x40000)) &&
                   (puVar25 = (uint *)ZSTD_count((BYTE *)puVar24,pBVar46 + UVar15,pBVar2),
                   uVar30 = local_d8, (uint *)0x2 < puVar25)) {
                  pZVar4->off = uVar34 + 2;
                  pZVar4->len = (U32)puVar25;
                  uVar36 = 1;
                  puVar19 = puVar25;
                  if (puVar25 <= (uint *)(ulong)uVar39 &&
                      (BYTE *)((long)puVar25 + (long)puVar24) != pBVar2) goto LAB_00118ec3;
                  UVar15 = (int)local_c8 + 1;
                  uVar36 = 1;
                }
                else {
LAB_00118ec3:
                  local_80[local_78] = (U32)local_c8;
                  local_c8 = (ulong)((U32)local_c8 + 2);
                  puVar25 = (uint *)0x0;
                  puVar20 = (uint *)0x0;
LAB_00118ef7:
                  bVar47 = iVar12 == 0;
                  iVar12 = iVar12 + -1;
                  puVar26 = local_110;
                  if ((bVar47) || (uVar39 = (uint)uVar30, uVar39 < uVar40)) goto LAB_001190a1;
                  puVar27 = puVar25;
                  if (puVar20 < puVar25) {
                    puVar27 = puVar20;
                  }
                  sVar18 = ZSTD_count((BYTE *)((long)puVar24 + (long)puVar27),
                                      pBVar46 + (uVar30 & 0xffffffff) + (long)puVar27,pBVar2);
                  puVar27 = (uint *)(sVar18 + (long)puVar27);
                  puVar26 = local_110;
                  if (puVar19 < puVar27) {
                    iVar17 = uVar39 + (U32)puVar27;
                    if (puVar27 <= (uint *)(ulong)(iVar13 - uVar39)) {
                      iVar17 = iVar13;
                    }
                    pZVar4[uVar36].off = (int)local_c8 - uVar39;
                    pZVar4[uVar36].len = (U32)puVar27;
                    uVar36 = (ulong)((int)uVar36 + 1);
                    iVar13 = iVar17;
                    if (((uint *)0x1000 < puVar27) ||
                       (puVar19 = puVar27, (BYTE *)((long)puVar24 + (long)puVar27) == pBVar2))
                    goto LAB_001190a1;
                  }
                  puVar28 = local_108 + (uVar39 & (uint)local_118) * 2;
                  if (*(byte *)((long)puVar24 + (long)puVar27) <=
                      (pBVar46 + (uVar30 & 0xffffffff))[(long)puVar27]) {
                    *local_188 = uVar39;
                    local_188 = puVar28;
                    puVar25 = puVar27;
                    if (uVar39 <= (uint)local_100) {
                      local_188 = &local_11c;
                      goto LAB_001190a1;
                    }
LAB_0011904a:
                    uVar30 = (ulong)*puVar28;
                    goto LAB_00118ef7;
                  }
                  *local_110 = uVar39;
                  if ((uint)local_100 < uVar39) {
                    puVar28 = puVar28 + 1;
                    puVar20 = puVar27;
                    local_110 = puVar28;
                    goto LAB_0011904a;
                  }
                  puVar26 = &local_11c;
LAB_001190a1:
                  *local_188 = 0;
                  *puVar26 = 0;
                  UVar15 = iVar13 - 8;
                }
                ms->nextToUpdate = UVar15;
                goto LAB_001190b2;
              }
              uVar44 = (ulong)(uint)(UVar14 != 0);
              uVar39 = (ms->cParams).targetLength;
              if (0xffe < uVar39) {
                uVar39 = 0xfff;
              }
              local_108 = (U32 *)(ms->window).base;
              uVar42 = iVar13 - (int)local_108;
              local_78 = (ulong)(*puVar24 * -0x61c8864f >> (-(char)(ms->cParams).hashLog & 0x1fU));
              uVar36 = 0;
              local_e8 = ms->chainTable;
              uVar34 = ~(-1 << ((char)(ms->cParams).chainLog - 1U & 0x1f));
              iVar13 = uVar42 - uVar34;
              if (uVar42 < uVar34) {
                iVar13 = 0;
              }
              local_c8 = CONCAT44(local_c8._4_4_,iVar13);
              UVar15 = (ms->window).lowLimit;
              local_118 = (uint *)CONCAT44(local_118._4_4_,UVar15 + (UVar15 == 0));
              local_100 = (U32 *)CONCAT44(local_100._4_4_,uVar34);
              uVar33 = (ulong)((uVar34 & uVar42) * 2);
              local_178 = local_e8 + uVar33;
              local_170 = local_e8 + uVar33 + 1;
              UVar15 = (ms->window).dictLimit;
              iVar12 = 1 << ((byte)(ms->cParams).searchLog & 0x1f);
              local_80 = ms->hashTable;
              uVar34 = ms->hashTable[local_78];
              local_d8 = (ulong)uVar42;
              iVar13 = uVar42 + 9;
              uVar33 = uVar44 + 3;
              local_c0 = puVar24 + 1;
              local_88 = CONCAT44(local_88._4_4_,uVar39);
              puVar19 = local_e0;
              for (; uVar44 < uVar33; uVar44 = uVar44 + 1) {
                if (uVar44 == 3) {
                  uVar40 = pZVar3->rep[0] - 1;
                }
                else {
                  uVar40 = pUVar32[uVar31 * 7 + uVar44];
                }
                uVar35 = 0;
                if ((uVar40 - 1 < uVar42 - UVar15) &&
                   (uVar35 = 0, *puVar24 == *(uint *)((long)puVar24 - (ulong)uVar40))) {
                  local_110 = puVar19;
                  sVar18 = ZSTD_count((BYTE *)local_c0,(BYTE *)((long)local_c0 - (ulong)uVar40),
                                      pBVar2);
                  uVar35 = (int)sVar18 + 4;
                  puVar19 = local_110;
                  uVar39 = (uint)local_88;
                }
                puVar25 = (uint *)(ulong)uVar35;
                if (puVar19 < puVar25) {
                  pZVar4[uVar36].off = (int)uVar44 - (uint)(UVar14 != 0);
                  pZVar4[uVar36].len = uVar35;
                  uVar36 = (ulong)((int)uVar36 + 1);
                  if ((uVar39 < uVar35) ||
                     (puVar19 = puVar25, (BYTE *)((long)puVar24 + (long)puVar25) == pBVar2))
                  goto LAB_001190b2;
                }
              }
              local_80[local_78] = (U32)local_d8;
              local_d8 = (ulong)((U32)local_d8 + 2);
              puVar25 = (uint *)0x0;
              puVar20 = (uint *)0x0;
              while( true ) {
                bVar47 = iVar12 == 0;
                iVar12 = iVar12 + -1;
                iVar17 = iVar13;
                if ((bVar47) || (uVar34 < (uint)local_118)) break;
                puVar26 = puVar25;
                if (puVar20 < puVar25) {
                  puVar26 = puVar20;
                }
                lVar22 = (ulong)uVar34 + (long)local_108;
                sVar18 = ZSTD_count((BYTE *)((long)puVar24 + (long)puVar26),
                                    (BYTE *)(lVar22 + (long)puVar26),pBVar2);
                puVar26 = (uint *)(sVar18 + (long)puVar26);
                if (puVar19 < puVar26) {
                  iVar17 = uVar34 + (U32)puVar26;
                  if (puVar26 <= (uint *)(ulong)(iVar13 - uVar34)) {
                    iVar17 = iVar13;
                  }
                  pZVar4[uVar36].off = (int)local_d8 - uVar34;
                  pZVar4[uVar36].len = (U32)puVar26;
                  uVar36 = (ulong)((int)uVar36 + 1);
                  if (((uint *)0x1000 < puVar26) ||
                     (puVar19 = puVar26, iVar13 = iVar17,
                     (BYTE *)((long)puVar24 + (long)puVar26) == pBVar2)) break;
                }
                puVar27 = local_e8 + (uVar34 & (uint)local_100) * 2;
                if (*(byte *)(lVar22 + (long)puVar26) < *(byte *)((long)puVar24 + (long)puVar26)) {
                  *local_178 = uVar34;
                  if (uVar34 <= (uint)local_c8) goto LAB_00118e7f;
                  puVar27 = puVar27 + 1;
                  puVar20 = puVar26;
                  local_178 = puVar27;
                }
                else {
                  *local_170 = uVar34;
                  local_170 = puVar27;
                  puVar25 = puVar26;
                  if (uVar34 <= (uint)local_c8) goto LAB_00118e6c;
                }
                uVar34 = *puVar27;
              }
            }
            goto LAB_00118e90;
          }
          uVar44 = (ulong)(UVar14 != 0);
          uVar39 = (ms->cParams).targetLength;
          if (0xffe < uVar39) {
            uVar39 = 0xfff;
          }
          local_108 = (U32 *)(ms->window).base;
          uVar42 = iVar13 - (int)local_108;
          local_78 = (ulong)(*(long *)puVar24 * -0x30e4432340650000) >>
                     (-(char)(ms->cParams).hashLog & 0x3fU);
          uVar36 = 0;
          local_e8 = ms->chainTable;
          uVar34 = ~(-1 << ((char)(ms->cParams).chainLog - 1U & 0x1f));
          iVar13 = uVar42 - uVar34;
          if (uVar42 < uVar34) {
            iVar13 = 0;
          }
          local_c8 = CONCAT44(local_c8._4_4_,iVar13);
          UVar15 = (ms->window).lowLimit;
          local_118 = (uint *)CONCAT44(local_118._4_4_,UVar15 + (UVar15 == 0));
          local_100 = (U32 *)CONCAT44(local_100._4_4_,uVar34);
          uVar33 = (ulong)((uVar34 & uVar42) * 2);
          local_178 = local_e8 + uVar33;
          local_170 = local_e8 + uVar33 + 1;
          UVar15 = (ms->window).dictLimit;
          iVar13 = 1 << ((byte)(ms->cParams).searchLog & 0x1f);
          local_80 = ms->hashTable;
          uVar34 = ms->hashTable[local_78];
          local_d8 = (ulong)uVar42;
          iVar12 = uVar42 + 9;
          uVar33 = uVar44 + 3;
          local_c0 = puVar24 + 1;
          local_88 = CONCAT44(local_88._4_4_,uVar39);
          puVar19 = local_e0;
          for (; uVar44 < uVar33; uVar44 = uVar44 + 1) {
            if (uVar44 == 3) {
              uVar40 = pZVar3->rep[0] - 1;
            }
            else {
              uVar40 = pUVar32[uVar31 * 7 + uVar44];
            }
            uVar35 = 0;
            if ((uVar40 - 1 < uVar42 - UVar15) &&
               (uVar35 = 0, *puVar24 == *(uint *)((long)puVar24 - (ulong)uVar40))) {
              local_110 = puVar19;
              sVar18 = ZSTD_count((BYTE *)local_c0,(BYTE *)((long)local_c0 - (ulong)uVar40),pBVar2);
              uVar35 = (int)sVar18 + 4;
              puVar19 = local_110;
              uVar39 = (uint)local_88;
            }
            puVar25 = (uint *)(ulong)uVar35;
            if (puVar19 < puVar25) {
              pZVar4[uVar36].off = (int)uVar44 - (uint)(UVar14 != 0);
              pZVar4[uVar36].len = uVar35;
              uVar36 = (ulong)((int)uVar36 + 1);
              if ((uVar39 < uVar35) ||
                 (puVar19 = puVar25, (BYTE *)((long)puVar24 + (long)puVar25) == pBVar2))
              goto LAB_001190b2;
            }
          }
          local_80[local_78] = (U32)local_d8;
          local_d8 = (ulong)((U32)local_d8 + 2);
          puVar25 = (uint *)0x0;
          puVar20 = (uint *)0x0;
LAB_0011849e:
          bVar47 = iVar13 == 0;
          iVar13 = iVar13 + -1;
          iVar17 = iVar12;
          if ((bVar47) || (uVar34 < (uint)local_118)) goto LAB_00118e57;
          puVar26 = puVar25;
          if (puVar20 < puVar25) {
            puVar26 = puVar20;
          }
          lVar22 = (ulong)uVar34 + (long)local_108;
          sVar18 = ZSTD_count((BYTE *)((long)puVar24 + (long)puVar26),
                              (BYTE *)((long)puVar26 + lVar22),pBVar2);
          puVar26 = (uint *)(sVar18 + (long)puVar26);
          if (puVar19 < puVar26) {
            iVar17 = uVar34 + (U32)puVar26;
            if (puVar26 <= (uint *)(ulong)(iVar12 - uVar34)) {
              iVar17 = iVar12;
            }
            pZVar4[uVar36].off = (int)local_d8 - uVar34;
            pZVar4[uVar36].len = (U32)puVar26;
            uVar36 = (ulong)((int)uVar36 + 1);
            if (((uint *)0x1000 < puVar26) ||
               (puVar19 = puVar26, iVar12 = iVar17,
               (BYTE *)((long)puVar24 + (long)puVar26) == pBVar2)) goto LAB_00118e57;
          }
          puVar27 = local_e8 + (uVar34 & (uint)local_100) * 2;
          iVar17 = iVar12;
          if (*(byte *)((long)puVar24 + (long)puVar26) <= *(byte *)(lVar22 + (long)puVar26)) {
            *local_170 = uVar34;
            local_170 = puVar27;
            puVar25 = puVar26;
            if (uVar34 <= (uint)local_c8) {
              local_170 = &local_11c;
              goto LAB_00118e57;
            }
LAB_00118605:
            uVar34 = *puVar27;
            goto LAB_0011849e;
          }
          *local_178 = uVar34;
          if ((uint)local_c8 < uVar34) {
            puVar27 = puVar27 + 1;
            puVar20 = puVar26;
            local_178 = puVar27;
            goto LAB_00118605;
          }
          local_178 = &local_11c;
LAB_00118e57:
          *local_170 = 0;
          *local_178 = 0;
          ms->nextToUpdate = iVar17 - 8;
          goto LAB_001190b2;
        }
      }
      uVar29 = uVar29 & 0xffffffff;
      local_64 = pZVar5[uVar29].price;
      UVar10 = pZVar5[uVar29].off;
      uVar39 = pZVar5[uVar29].mlen;
      UVar9 = pZVar5[uVar29].litlen;
      local_58 = pZVar5[uVar29].rep[2];
      local_60 = *(undefined8 *)pZVar5[uVar29].rep;
      uVar8 = uVar34 - (uVar39 + UVar9);
      if (uVar34 < uVar39 + UVar9) {
        uVar8 = 0;
      }
      uVar29 = (ulong)uVar8;
    }
LAB_001192f9:
    uVar8 = (int)uVar29 + 1;
    pZVar5[uVar8].price = local_64;
    pZVar5[uVar8].off = UVar10;
    pZVar5[uVar8].mlen = uVar39;
    pZVar5[uVar8].litlen = UVar9;
    *(undefined8 *)pZVar5[uVar8].rep = local_60;
    pZVar5[uVar8].rep[2] = local_58;
    uVar44 = uVar29;
    while( true ) {
      uVar39 = (uint)uVar29;
      uVar34 = (uint)uVar44;
      if (uVar39 == 0) break;
      uVar40 = pZVar5[uVar29].litlen + pZVar5[uVar29].mlen;
      pZVar23 = pZVar5 + uVar29;
      iVar11 = pZVar23->price;
      UVar9 = pZVar23->off;
      UVar10 = pZVar23->mlen;
      UVar15 = pZVar23->litlen;
      pZVar23 = pZVar5 + uVar29;
      UVar14 = pZVar23->rep[0];
      uVar6 = *(undefined8 *)(&pZVar23->litlen + 2);
      pZVar3 = pZVar5 + uVar44;
      pZVar3->litlen = pZVar23->litlen;
      pZVar3->rep[0] = UVar14;
      *(undefined8 *)(&pZVar3->litlen + 2) = uVar6;
      pZVar23 = pZVar5 + uVar44;
      pZVar23->price = iVar11;
      pZVar23->off = UVar9;
      pZVar23->mlen = UVar10;
      pZVar23->litlen = UVar15;
      uVar42 = uVar39 - uVar40;
      if (uVar39 < uVar40) {
        uVar42 = 0;
      }
      uVar29 = (ulong)uVar42;
      uVar44 = (ulong)(uVar34 - 1);
    }
    local_160 = local_f8 & 0xffffffff;
    local_1b0 = local_f8 >> 0x20;
    while( true ) {
      uVar34 = uVar34 + 1;
      if (uVar8 < uVar34) break;
      uVar39 = pZVar5[uVar34].litlen;
      uVar29 = (ulong)uVar39;
      UVar14 = pZVar5[uVar34].mlen;
      if (UVar14 == 0) {
        puVar45 = (uint *)(uVar29 + (long)local_148);
      }
      else {
        uVar42 = pZVar5[uVar34].off;
        if (uVar42 < 3) {
          uVar40 = (uVar29 == 0) + uVar42;
          if (uVar40 != 0) {
            if (uVar40 == 3) {
              uVar44 = (ulong)((int)local_160 - 1);
LAB_00119429:
              local_f0 = (U32)local_1b0;
            }
            else {
              uVar44 = (ulong)*(uint *)((long)&local_f8 + (ulong)uVar40 * 4);
              if (uVar40 != 1) goto LAB_00119429;
            }
            uVar40 = (uint)uVar44;
            goto LAB_0011944e;
          }
        }
        else {
          local_f0 = (U32)local_1b0;
          uVar40 = uVar42 - 2;
          uVar44 = (ulong)uVar40;
LAB_0011944e:
          local_f8 = CONCAT44((int)local_160,uVar40);
          local_1b0 = local_160;
          local_160 = uVar44;
        }
        ZSTD_updateStats(local_b8,uVar39,(BYTE *)local_148,uVar42,UVar14);
        ZSTD_storeSeq(local_50,uVar29,local_148,uVar42,(ulong)(UVar14 - 3));
        puVar45 = (uint *)((long)local_148 + (ulong)(uVar39 + UVar14));
        local_148 = puVar45;
      }
    }
    ZSTD_setBasePrices(local_b8,2);
    ssPtr = local_50;
  }
  goto LAB_00116c45;
LAB_00118e6c:
  local_170 = &local_11c;
  iVar17 = iVar13;
  goto LAB_00118e90;
LAB_00118e7f:
  local_178 = &local_11c;
  iVar17 = iVar13;
LAB_00118e90:
  *local_170 = 0;
  *local_178 = 0;
  ms->nextToUpdate = iVar17 - 8;
LAB_001190b2:
  if ((int)uVar36 != 0) {
    uVar34 = (int)uVar36 - 1;
    uVar39 = pZVar4[uVar34].len;
    if (((uint)local_90 < uVar39) || (0xfff < uVar39 + uVar8)) {
      UVar14 = 0;
      if (pZVar3->mlen == 0) {
        UVar14 = pZVar3->litlen;
      }
      UVar10 = pZVar4[uVar34].off;
      uVar29 = (ulong)(uVar8 - UVar14);
      if (0x1000 < uVar8 - UVar14) {
        uVar29 = 0;
      }
      goto LAB_001192f9;
    }
    pUVar32 = (U32 *)((long)pZVar5->rep + (long)local_40);
    for (uVar44 = 0; uVar44 != uVar36; uVar44 = uVar44 + 1) {
      UVar15 = pZVar4[uVar44].off;
      rVar48 = ZSTD_updateRep(pUVar32,UVar15,(uint)(UVar14 != 0));
      uVar39 = (uint)local_a0;
      if (uVar44 != 0) {
        uVar39 = pZVar4[uVar44 - 1].len + 1;
      }
      uVar34 = pZVar4[uVar44].len;
      uVar42 = 0x1f;
      if (UVar15 + 1 != 0) {
        for (; UVar15 + 1 >> uVar42 == 0; uVar42 = uVar42 - 1) {
        }
      }
      for (; uVar39 <= uVar34; uVar34 = uVar34 - 1) {
        if ((ms->opt).priceType == zop_predef) {
          uVar40 = uVar34 - 2;
          iVar13 = 0x1f;
          if (uVar40 != 0) {
            for (; uVar40 >> iVar13 == 0; iVar13 = iVar13 + -1) {
            }
          }
          iVar13 = (iVar13 + uVar42) * 0x100 + (uVar40 * 0x100 >> ((byte)iVar13 & 0x1f)) + 0x1000;
        }
        else {
          uVar35 = uVar34 - 3;
          uVar40 = (ms->opt).offCodeFreq[uVar42] + 1;
          iVar13 = 0x1f;
          if (uVar40 != 0) {
            for (; uVar40 >> iVar13 == 0; iVar13 = iVar13 + -1) {
            }
          }
          if (uVar35 < 0x80) {
            uVar35 = (uint)(byte)(&ZSTD_MLcode_ML_Code)[uVar35];
          }
          else {
            uVar43 = 0x1f;
            if (uVar35 != 0) {
              for (; uVar35 >> uVar43 == 0; uVar43 = uVar43 - 1) {
              }
            }
            uVar35 = (uVar43 ^ 0xffffffe0) + 0x44;
          }
          uVar43 = (ms->opt).matchLengthFreq[uVar35] + 1;
          iVar12 = 0x1f;
          if (uVar43 != 0) {
            for (; uVar43 >> iVar12 == 0; iVar12 = iVar12 + -1) {
            }
          }
          iVar13 = ((ML_bits[uVar35] + uVar42) - (iVar13 + iVar12)) * 0x100 +
                   (((ms->opt).offCodeSumBasePrice + (ms->opt).matchLengthSumBasePrice) -
                   ((uVar40 * 0x100 >> ((byte)iVar13 & 0x1f)) +
                   (uVar43 * 0x100 >> ((byte)iVar12 & 0x1f)))) + 0x33;
        }
        iVar13 = iVar13 + UVar10 + iVar11;
        uVar31 = (ulong)(uVar34 + uVar8);
        if (((uint)uVar29 < uVar34 + uVar8) || (iVar13 < pZVar5[uVar31].price)) {
          uVar29 = uVar29 & 0xffffffff;
          pZVar23 = local_70 + uVar29;
          for (; uVar29 < uVar31; uVar29 = uVar29 + 1) {
            pZVar23->price = 0x40000000;
            pZVar23 = pZVar23 + 1;
          }
          pZVar5[uVar31].mlen = uVar34;
          pZVar5[uVar31].off = UVar15;
          pZVar5[uVar31].litlen = UVar9;
          pZVar5[uVar31].price = iVar13;
          *(long *)pZVar5[uVar31].rep = rVar48.rep._0_8_;
          pZVar5[uVar31].rep[2] = rVar48.rep[2];
        }
      }
    }
  }
LAB_001192ad:
  uVar31 = (ulong)(uVar8 + 1);
  goto LAB_00117e5a;
LAB_0011a418:
  local_1b8 = (U32 *)&local_f8;
  local_138 = local_198;
  goto LAB_0011a5d8;
LAB_0011a5a2:
  local_138 = (U32 *)&local_f8;
LAB_0011a5d8:
  *local_1b8 = 0;
  *local_138 = 0;
  UVar14 = iVar11 - 8;
LAB_0011a5e1:
  ms->nextToUpdate = UVar14;
LAB_0011a5e9:
  poVar7 = local_b8;
  src = local_a8;
  if ((int)uVar44 == 0) {
LAB_0011a5fb:
    puVar45 = (uint *)((long)puVar45 + 1);
  }
  else {
    for (lVar22 = 4; lVar22 != 7; lVar22 = lVar22 + 1) {
      pZVar5->rep[lVar22 + -4] = local_98[lVar22 + -4];
    }
    pZVar5->mlen = 0;
    pZVar5->litlen = (U32)local_160;
    iVar11 = ZSTD_literalsContribution((BYTE *)local_a8,(U32)local_160,local_b8,2);
    pZVar5->price = iVar11;
    uVar8 = (int)uVar44 - 1;
    uVar39 = pZVar4[uVar8].len;
    if ((uint)local_d8 < uVar39) {
      UVar9 = pZVar4[uVar8].off;
      uVar29 = 0;
      iVar11 = (uint)local_88;
    }
    else {
      UVar14 = ZSTD_litLengthPrice(0,poVar7,2);
      pZVar23 = local_70;
      for (uVar29 = 1; uVar29 < local_48; uVar29 = uVar29 + 1) {
        pZVar23->price = 0x40000000;
        pZVar23 = pZVar23 + 1;
      }
      for (uVar36 = 0; uVar36 != uVar44; uVar36 = uVar36 + 1) {
        UVar9 = pZVar4[uVar36].off;
        uVar39 = pZVar4[uVar36].len;
        rVar48 = ZSTD_updateRep(local_98,UVar9,(uint)((U32)local_160 == 0));
        uVar8 = 0x1f;
        if (UVar9 + 1 != 0) {
          for (; UVar9 + 1 >> uVar8 == 0; uVar8 = uVar8 - 1) {
          }
        }
        uVar34 = (int)uVar29 * 0x100 - 0x200;
        while (uVar42 = (uint)uVar29, uVar42 <= uVar39) {
          if ((ms->opt).priceType == zop_predef) {
            iVar13 = 0x1f;
            if (uVar42 - 2 != 0) {
              for (; uVar42 - 2 >> iVar13 == 0; iVar13 = iVar13 + -1) {
              }
            }
            iVar13 = (iVar13 + uVar8) * 0x100 + (uVar34 >> ((byte)iVar13 & 0x1f)) + 0x1000;
          }
          else {
            uVar35 = uVar42 - 3;
            uVar40 = (ms->opt).offCodeFreq[uVar8] + 1;
            iVar13 = 0x1f;
            if (uVar40 != 0) {
              for (; uVar40 >> iVar13 == 0; iVar13 = iVar13 + -1) {
              }
            }
            if (uVar35 < 0x80) {
              uVar35 = (uint)(byte)(&ZSTD_MLcode_ML_Code)[uVar35];
            }
            else {
              uVar43 = 0x1f;
              if (uVar35 != 0) {
                for (; uVar35 >> uVar43 == 0; uVar43 = uVar43 - 1) {
                }
              }
              uVar35 = (uVar43 ^ 0xffffffe0) + 0x44;
            }
            uVar43 = (ms->opt).matchLengthFreq[uVar35] + 1;
            iVar12 = 0x1f;
            if (uVar43 != 0) {
              for (; uVar43 >> iVar12 == 0; iVar12 = iVar12 + -1) {
              }
            }
            iVar13 = ((ML_bits[uVar35] + uVar8) - (iVar13 + iVar12)) * 0x100 +
                     (((ms->opt).offCodeSumBasePrice + (ms->opt).matchLengthSumBasePrice) -
                     ((uVar40 * 0x100 >> ((byte)iVar13 & 0x1f)) +
                     (uVar43 * 0x100 >> ((byte)iVar12 & 0x1f)))) + 0x33;
          }
          uVar29 = uVar29 & 0xffffffff;
          pZVar5[uVar29].mlen = uVar42;
          pZVar5[uVar29].off = UVar9;
          pZVar5[uVar29].litlen = (U32)local_160;
          pZVar5[uVar29].price = iVar13 + UVar14 + iVar11;
          *(long *)pZVar5[uVar29].rep = rVar48.rep._0_8_;
          pZVar5[uVar29].rep[2] = rVar48.rep[2];
          uVar34 = uVar34 + 0x100;
          uVar29 = (ulong)(uVar42 + 1);
        }
      }
      uVar29 = (ulong)((int)uVar29 - 1);
      uVar44 = 1;
LAB_0011a867:
      poVar7 = local_b8;
      uVar34 = (uint)uVar44;
      uVar8 = (uint)uVar29;
      if (uVar34 <= uVar8) {
        pZVar23 = pZVar5 + (uVar34 - 1);
        UVar14 = 1;
        if (pZVar5[uVar34 - 1].mlen == 0) {
          UVar14 = pZVar23->litlen + 1;
        }
        puVar24 = (uint *)((long)puVar45 + uVar44);
        iVar11 = pZVar23->price;
        UVar9 = ZSTD_rawLiteralsCost((BYTE *)((long)puVar24 + -1),1,local_b8,2);
        UVar10 = ZSTD_litLengthPrice(UVar14,poVar7,2);
        UVar15 = ZSTD_litLengthPrice(UVar14 - 1,poVar7,2);
        iVar13 = (UVar10 + UVar9 + iVar11) - UVar15;
        pZVar3 = pZVar5 + uVar44;
        iVar11 = pZVar5[uVar44].price;
        if (iVar13 <= pZVar5[uVar44].price) {
          pZVar3->off = 0;
          pZVar3->mlen = 0;
          pZVar3->litlen = UVar14;
          pZVar3->price = iVar13;
          *(undefined8 *)pZVar3->rep = *(undefined8 *)pZVar23->rep;
          pZVar3->rep[2] = pZVar23->rep[2];
          iVar11 = iVar13;
        }
        if (local_110 < puVar24) goto LAB_0011bc59;
        if (uVar34 != uVar8) {
          UVar14 = pZVar3->mlen;
          local_160._0_4_ = 0;
          if (UVar14 == 0) {
            local_160._0_4_ = pZVar3->litlen;
          }
          local_c8 = uVar44 * 0x1c;
          UVar9 = ZSTD_litLengthPrice(0,local_b8,2);
          pUVar32 = local_40;
          pBVar46 = (ms->window).base;
          uVar36 = (ulong)ms->nextToUpdate;
          if (puVar24 < pBVar46 + uVar36) goto LAB_0011bc59;
          UVar10 = (ms->cParams).minMatch;
          iVar13 = (int)puVar24;
          uVar39 = iVar13 - (int)pBVar46;
          for (; (uint)uVar36 < uVar39; uVar36 = (ulong)((uint)uVar36 + UVar15)) {
            UVar15 = ZSTD_insertBt1(ms,pBVar46 + uVar36,pBVar2,UVar10,0);
          }
          ms->nextToUpdate = uVar39;
          local_1a8 = (U32 *)local_a0;
          if (UVar10 - 6 < 2) {
            uVar36 = (ulong)(UVar14 != 0);
            uVar39 = (ms->cParams).targetLength;
            if (0xffe < uVar39) {
              uVar39 = 0xfff;
            }
            local_118 = (uint *)(ms->window).base;
            uVar42 = iVar13 - (int)local_118;
            local_e8 = (uint *)(ulong)uVar42;
            local_c0 = (uint *)((ulong)(*(long *)puVar24 * -0x30e4432340650000) >>
                               (-(char)(ms->cParams).hashLog & 0x3fU));
            uVar31 = 0;
            local_108 = ms->chainTable;
            uVar8 = ~(-1 << ((char)(ms->cParams).chainLog - 1U & 0x1f));
            iVar13 = uVar42 - uVar8;
            if (uVar42 < uVar8) {
              iVar13 = 0;
            }
            local_100 = (U32 *)CONCAT44(local_100._4_4_,iVar13);
            UVar10 = (ms->window).lowLimit;
            local_d0 = (uint *)CONCAT44(local_d0._4_4_,UVar10 + (UVar10 == 0));
            local_e0 = (uint *)CONCAT44(local_e0._4_4_,uVar8);
            uVar33 = (ulong)((uVar8 & uVar42) * 2);
            local_178 = local_108 + uVar33;
            local_188 = local_108 + uVar33 + 1;
            UVar10 = (ms->window).dictLimit;
            iVar13 = 1 << ((byte)(ms->cParams).searchLog & 0x1f);
            local_90 = ms->hashTable;
            uVar8 = local_90[(long)local_c0];
            uVar33 = uVar36 + 3;
            local_b0 = puVar24 + 1;
            for (; uVar36 < uVar33; uVar36 = uVar36 + 1) {
              if (uVar36 == 3) {
                uVar40 = pZVar3->rep[0] - 1;
              }
              else {
                uVar40 = pUVar32[uVar44 * 7 + uVar36];
              }
              uVar35 = 0;
              if ((uVar40 - 1 < uVar42 - UVar10) &&
                 (uVar35 = 0, *puVar24 == *(uint *)((long)puVar24 - (ulong)uVar40))) {
                sVar18 = ZSTD_count((BYTE *)local_b0,(BYTE *)((long)local_b0 - (ulong)uVar40),pBVar2
                                   );
                uVar35 = (int)sVar18 + 4;
              }
              uVar30 = (ulong)uVar35;
              if (local_1a8 < uVar30) {
                pZVar4[uVar31].off = (int)uVar36 - (uint)(UVar14 != 0);
                pZVar4[uVar31].len = uVar35;
                uVar31 = (ulong)((int)uVar31 + 1);
                if ((uVar39 < uVar35) ||
                   (local_1a8 = (U32 *)uVar30, (BYTE *)((long)puVar24 + uVar30) == pBVar2))
                goto LAB_0011ba54;
              }
            }
            local_90[(long)local_c0] = (U32)local_e8;
            local_e8 = (uint *)(ulong)((U32)local_e8 + 2);
            uVar44 = 0;
            uVar36 = 0;
            iVar12 = uVar42 + 9;
            while( true ) {
              puVar19 = local_118;
              bVar47 = iVar13 == 0;
              iVar13 = iVar13 + -1;
              local_140 = local_178;
              iVar17 = iVar12;
              if ((bVar47) || (uVar8 < (uint)local_d0)) break;
              uVar33 = uVar36;
              if (uVar44 < uVar36) {
                uVar33 = uVar44;
              }
              sVar18 = ZSTD_count((BYTE *)((long)puVar24 + uVar33),
                                  (BYTE *)((long)local_118 + uVar33 + uVar8),pBVar2);
              uVar33 = sVar18 + uVar33;
              if (local_1a8 < uVar33) {
                iVar17 = uVar8 + (U32)uVar33;
                if (uVar33 <= iVar12 - uVar8) {
                  iVar17 = iVar12;
                }
                pZVar4[uVar31].off = (int)local_e8 - uVar8;
                pZVar4[uVar31].len = (U32)uVar33;
                uVar31 = (ulong)((int)uVar31 + 1);
                if ((0x1000 < uVar33) ||
                   (local_1a8 = (U32 *)uVar33, (BYTE *)((long)puVar24 + uVar33) == pBVar2)) break;
              }
              puVar25 = local_108 + (uVar8 & (uint)local_e0) * 2;
              if (*(byte *)((long)puVar19 + uVar33 + uVar8) < *(byte *)((long)puVar24 + uVar33)) {
                *local_178 = uVar8;
                if (uVar8 <= (uint)local_100) goto LAB_0011b813;
                puVar25 = puVar25 + 1;
                uVar44 = uVar33;
                uVar33 = uVar36;
                local_178 = puVar25;
              }
              else {
                *local_188 = uVar8;
                local_188 = puVar25;
                if (uVar8 <= (uint)local_100) goto LAB_0011b827;
              }
              uVar8 = *puVar25;
              uVar36 = uVar33;
              iVar12 = iVar17;
            }
            goto LAB_0011ba43;
          }
          if (UVar10 == 5) {
            uVar36 = (ulong)(uint)(UVar14 != 0);
            uVar39 = (ms->cParams).targetLength;
            if (0xffe < uVar39) {
              uVar39 = 0xfff;
            }
            local_118 = (uint *)(ms->window).base;
            uVar42 = iVar13 - (int)local_118;
            local_e8 = (uint *)(ulong)uVar42;
            local_c0 = (uint *)((ulong)(*(long *)puVar24 * -0x30e4432345000000) >>
                               (-(char)(ms->cParams).hashLog & 0x3fU));
            uVar31 = 0;
            local_108 = ms->chainTable;
            uVar8 = ~(-1 << ((char)(ms->cParams).chainLog - 1U & 0x1f));
            iVar13 = uVar42 - uVar8;
            if (uVar42 < uVar8) {
              iVar13 = 0;
            }
            local_100 = (U32 *)CONCAT44(local_100._4_4_,iVar13);
            UVar10 = (ms->window).lowLimit;
            local_d0 = (uint *)CONCAT44(local_d0._4_4_,UVar10 + (UVar10 == 0));
            local_e0 = (uint *)CONCAT44(local_e0._4_4_,uVar8);
            uVar33 = (ulong)((uVar8 & uVar42) * 2);
            local_178 = local_108 + uVar33;
            local_188 = local_108 + uVar33 + 1;
            UVar10 = (ms->window).dictLimit;
            iVar13 = 1 << ((byte)(ms->cParams).searchLog & 0x1f);
            local_90 = ms->hashTable;
            uVar8 = local_90[(long)local_c0];
            uVar33 = uVar36 + 3;
            local_b0 = puVar24 + 1;
            for (; uVar36 < uVar33; uVar36 = uVar36 + 1) {
              if (uVar36 == 3) {
                uVar40 = pZVar3->rep[0] - 1;
              }
              else {
                uVar40 = pUVar32[uVar44 * 7 + uVar36];
              }
              uVar35 = 0;
              if ((uVar40 - 1 < uVar42 - UVar10) &&
                 (uVar35 = 0, *puVar24 == *(uint *)((long)puVar24 - (ulong)uVar40))) {
                sVar18 = ZSTD_count((BYTE *)local_b0,(BYTE *)((long)local_b0 - (ulong)uVar40),pBVar2
                                   );
                uVar35 = (int)sVar18 + 4;
              }
              uVar30 = (ulong)uVar35;
              if (local_1a8 < uVar30) {
                pZVar4[uVar31].off = (int)uVar36 - (uint)(UVar14 != 0);
                pZVar4[uVar31].len = uVar35;
                uVar31 = (ulong)((int)uVar31 + 1);
                if ((uVar39 < uVar35) ||
                   (local_1a8 = (U32 *)uVar30, (BYTE *)((long)puVar24 + uVar30) == pBVar2))
                goto LAB_0011ba54;
              }
            }
            local_90[(long)local_c0] = (U32)local_e8;
            local_e8 = (uint *)(ulong)((U32)local_e8 + 2);
            uVar44 = 0;
            uVar36 = 0;
            iVar12 = uVar42 + 9;
            while( true ) {
              puVar19 = local_118;
              bVar47 = iVar13 == 0;
              iVar13 = iVar13 + -1;
              local_140 = local_178;
              iVar17 = iVar12;
              if ((bVar47) || (uVar8 < (uint)local_d0)) break;
              uVar33 = uVar36;
              if (uVar44 < uVar36) {
                uVar33 = uVar44;
              }
              sVar18 = ZSTD_count((BYTE *)((long)puVar24 + uVar33),
                                  (BYTE *)((long)local_118 + uVar33 + uVar8),pBVar2);
              uVar33 = sVar18 + uVar33;
              if (local_1a8 < uVar33) {
                iVar17 = uVar8 + (U32)uVar33;
                if (uVar33 <= iVar12 - uVar8) {
                  iVar17 = iVar12;
                }
                pZVar4[uVar31].off = (int)local_e8 - uVar8;
                pZVar4[uVar31].len = (U32)uVar33;
                uVar31 = (ulong)((int)uVar31 + 1);
                if ((0x1000 < uVar33) ||
                   (local_1a8 = (U32 *)uVar33, (BYTE *)((long)puVar24 + uVar33) == pBVar2)) break;
              }
              puVar25 = local_108 + (uVar8 & (uint)local_e0) * 2;
              if (*(byte *)((long)puVar19 + uVar33 + uVar8) < *(byte *)((long)puVar24 + uVar33)) {
                *local_178 = uVar8;
                if (uVar8 <= (uint)local_100) goto LAB_0011b813;
                puVar25 = puVar25 + 1;
                uVar44 = uVar33;
                uVar33 = uVar36;
                local_178 = puVar25;
              }
              else {
                *local_188 = uVar8;
                local_188 = puVar25;
                if (uVar8 <= (uint)local_100) goto LAB_0011b827;
              }
              uVar8 = *puVar25;
              uVar36 = uVar33;
              iVar12 = iVar17;
            }
            goto LAB_0011ba43;
          }
          if (UVar10 != 3) {
            uVar36 = (ulong)(uint)(UVar14 != 0);
            uVar39 = (ms->cParams).targetLength;
            if (0xffe < uVar39) {
              uVar39 = 0xfff;
            }
            local_118 = (uint *)(ms->window).base;
            uVar42 = iVar13 - (int)local_118;
            local_e8 = (uint *)(ulong)uVar42;
            local_c0 = (uint *)(ulong)(*puVar24 * -0x61c8864f >>
                                      (-(char)(ms->cParams).hashLog & 0x1fU));
            uVar31 = 0;
            local_108 = ms->chainTable;
            uVar8 = ~(-1 << ((char)(ms->cParams).chainLog - 1U & 0x1f));
            iVar13 = uVar42 - uVar8;
            if (uVar42 < uVar8) {
              iVar13 = 0;
            }
            local_100 = (U32 *)CONCAT44(local_100._4_4_,iVar13);
            UVar10 = (ms->window).lowLimit;
            local_d0 = (uint *)CONCAT44(local_d0._4_4_,UVar10 + (UVar10 == 0));
            local_e0 = (uint *)CONCAT44(local_e0._4_4_,uVar8);
            uVar33 = (ulong)((uVar8 & uVar42) * 2);
            local_178 = local_108 + uVar33;
            local_188 = local_108 + uVar33 + 1;
            UVar10 = (ms->window).dictLimit;
            iVar13 = 1 << ((byte)(ms->cParams).searchLog & 0x1f);
            local_90 = ms->hashTable;
            uVar8 = local_90[(long)local_c0];
            uVar33 = uVar36 + 3;
            local_b0 = puVar24 + 1;
            for (; uVar36 < uVar33; uVar36 = uVar36 + 1) {
              if (uVar36 == 3) {
                uVar40 = pZVar3->rep[0] - 1;
              }
              else {
                uVar40 = pUVar32[uVar44 * 7 + uVar36];
              }
              uVar35 = 0;
              if ((uVar40 - 1 < uVar42 - UVar10) &&
                 (uVar35 = 0, *puVar24 == *(uint *)((long)puVar24 - (ulong)uVar40))) {
                sVar18 = ZSTD_count((BYTE *)local_b0,(BYTE *)((long)local_b0 - (ulong)uVar40),pBVar2
                                   );
                uVar35 = (int)sVar18 + 4;
              }
              uVar30 = (ulong)uVar35;
              if (local_1a8 < uVar30) {
                pZVar4[uVar31].off = (int)uVar36 - (uint)(UVar14 != 0);
                pZVar4[uVar31].len = uVar35;
                uVar31 = (ulong)((int)uVar31 + 1);
                if ((uVar39 < uVar35) ||
                   (local_1a8 = (U32 *)uVar30, (BYTE *)((long)puVar24 + uVar30) == pBVar2))
                goto LAB_0011ba54;
              }
            }
            local_90[(long)local_c0] = (U32)local_e8;
            local_e8 = (uint *)(ulong)((U32)local_e8 + 2);
            uVar44 = 0;
            uVar36 = 0;
            iVar12 = uVar42 + 9;
            while( true ) {
              puVar19 = local_118;
              bVar47 = iVar13 == 0;
              iVar13 = iVar13 + -1;
              local_140 = local_178;
              iVar17 = iVar12;
              if ((bVar47) || (uVar8 < (uint)local_d0)) break;
              uVar33 = uVar36;
              if (uVar44 < uVar36) {
                uVar33 = uVar44;
              }
              sVar18 = ZSTD_count((BYTE *)((long)puVar24 + uVar33),
                                  (BYTE *)((long)local_118 + uVar33 + uVar8),pBVar2);
              uVar33 = sVar18 + uVar33;
              if (local_1a8 < uVar33) {
                iVar17 = uVar8 + (U32)uVar33;
                if (uVar33 <= iVar12 - uVar8) {
                  iVar17 = iVar12;
                }
                pZVar4[uVar31].off = (int)local_e8 - uVar8;
                pZVar4[uVar31].len = (U32)uVar33;
                uVar31 = (ulong)((int)uVar31 + 1);
                if ((0x1000 < uVar33) ||
                   (local_1a8 = (U32 *)uVar33, (BYTE *)((long)puVar24 + uVar33) == pBVar2)) break;
              }
              puVar25 = local_108 + (uVar8 & (uint)local_e0) * 2;
              if (*(byte *)((long)puVar19 + uVar33 + uVar8) < *(byte *)((long)puVar24 + uVar33)) {
                *local_178 = uVar8;
                if (uVar8 <= (uint)local_100) goto LAB_0011b813;
                puVar25 = puVar25 + 1;
                uVar44 = uVar33;
                uVar33 = uVar36;
                local_178 = puVar25;
              }
              else {
                *local_188 = uVar8;
                local_188 = puVar25;
                if (uVar8 <= (uint)local_100) goto LAB_0011b827;
              }
              uVar8 = *puVar25;
              uVar36 = uVar33;
              iVar12 = iVar17;
            }
            goto LAB_0011ba43;
          }
          uVar36 = (ulong)(uint)(UVar14 != 0);
          uVar39 = (ms->cParams).targetLength;
          if (0xffe < uVar39) {
            uVar39 = 0xfff;
          }
          pBVar46 = (ms->window).base;
          uVar42 = iVar13 - (int)pBVar46;
          local_108 = (U32 *)(ulong)uVar42;
          local_c0 = (uint *)(ulong)(*puVar24 * -0x61c8864f >>
                                    (-(char)(ms->cParams).hashLog & 0x1fU));
          uVar31 = 0;
          local_118 = ms->chainTable;
          uVar8 = ~(-1 << ((char)(ms->cParams).chainLog - 1U & 0x1f));
          iVar13 = uVar42 - uVar8;
          if (uVar42 < uVar8) {
            iVar13 = 0;
          }
          local_e0 = (uint *)CONCAT44(local_e0._4_4_,iVar13);
          UVar10 = (ms->window).lowLimit;
          uVar40 = UVar10 + (UVar10 == 0);
          local_d0 = (uint *)CONCAT44(local_d0._4_4_,uVar8);
          uVar33 = (ulong)((uVar8 & uVar42) * 2);
          local_140 = local_118 + uVar33;
          local_180 = local_118 + uVar33 + 1;
          UVar10 = (ms->window).dictLimit;
          iVar13 = 1 << ((byte)(ms->cParams).searchLog & 0x1f);
          local_90 = ms->hashTable;
          local_b0 = (uint *)(ulong)local_90[(long)local_c0];
          iVar17 = uVar42 + 9;
          uVar33 = uVar36 + 3;
          local_e8 = (uint *)((long)puVar24 + 3);
          local_100 = (U32 *)CONCAT44(local_100._4_4_,uVar39);
          for (; uVar36 < uVar33; uVar36 = uVar36 + 1) {
            if (uVar36 == 3) {
              uVar8 = pZVar3->rep[0] - 1;
            }
            else {
              uVar8 = pUVar32[uVar44 * 7 + uVar36];
            }
            uVar35 = 0;
            if ((uVar8 - 1 < uVar42 - UVar10) &&
               (uVar35 = 0, ((*(uint *)((long)puVar24 - (ulong)uVar8) ^ *puVar24) & 0xffffff) == 0))
            {
              sVar18 = ZSTD_count((BYTE *)local_e8,(BYTE *)((long)local_e8 - (ulong)uVar8),pBVar2);
              uVar35 = (int)sVar18 + 3;
              uVar39 = (uint)local_100;
            }
            uVar30 = (ulong)uVar35;
            if (local_1a8 < uVar30) {
              pZVar4[uVar31].off = (int)uVar36 - (uint)(UVar14 != 0);
              pZVar4[uVar31].len = uVar35;
              uVar31 = (ulong)((int)uVar31 + 1);
              if ((uVar39 < uVar35) ||
                 (local_1a8 = (U32 *)uVar30, (BYTE *)((long)puVar24 + uVar30) == pBVar2))
              goto LAB_0011ba54;
            }
          }
          if ((((2 < local_1a8) ||
               (UVar10 = ZSTD_insertAndFindFirstIndexHash3(ms,(BYTE *)puVar24), UVar10 < uVar40)) ||
              (uVar39 = (int)local_108 - UVar10, 0x3ffff < uVar39)) ||
             (sVar18 = ZSTD_count((BYTE *)puVar24,pBVar46 + UVar10,pBVar2), sVar18 < 3)) {
LAB_0011b867:
            local_90[(long)local_c0] = (U32)local_108;
            local_108 = (U32 *)(ulong)((U32)local_108 + 2);
            uVar44 = 0;
            uVar36 = 0;
            puVar19 = local_b0;
            do {
              bVar47 = iVar13 == 0;
              iVar13 = iVar13 + -1;
              local_188 = local_180;
              if ((bVar47) || (uVar39 = (uint)puVar19, uVar39 < uVar40)) goto LAB_0011ba43;
              uVar33 = uVar44;
              if (uVar36 < uVar44) {
                uVar33 = uVar36;
              }
              sVar18 = ZSTD_count((BYTE *)((long)puVar24 + uVar33),
                                  pBVar46 + uVar33 + ((ulong)puVar19 & 0xffffffff),pBVar2);
              uVar33 = sVar18 + uVar33;
              if (local_1a8 < uVar33) {
                iVar12 = uVar39 + (U32)uVar33;
                if (uVar33 <= iVar17 - uVar39) {
                  iVar12 = iVar17;
                }
                iVar17 = iVar12;
                pZVar4[uVar31].off = (int)local_108 - uVar39;
                pZVar4[uVar31].len = (U32)uVar33;
                uVar31 = (ulong)((int)uVar31 + 1);
                if ((0x1000 < uVar33) ||
                   (local_1a8 = (U32 *)uVar33, (BYTE *)((long)puVar24 + uVar33) == pBVar2))
                goto LAB_0011ba43;
              }
              puVar25 = local_118 + (uVar39 & (uint)local_d0) * 2;
              if (pBVar46[uVar33 + ((ulong)puVar19 & 0xffffffff)] <
                  *(byte *)((long)puVar24 + uVar33)) {
                *local_140 = uVar39;
                if (uVar39 <= (uint)local_e0) {
                  local_140 = (uint *)&local_f8;
                  goto LAB_0011ba43;
                }
                puVar25 = puVar25 + 1;
                uVar36 = uVar33;
                local_140 = puVar25;
              }
              else {
                *local_180 = uVar39;
                local_180 = puVar25;
                uVar44 = uVar33;
                if (uVar39 <= (uint)local_e0) {
                  local_188 = (uint *)&local_f8;
                  goto LAB_0011ba43;
                }
              }
              puVar19 = (uint *)(ulong)*puVar25;
            } while( true );
          }
          pZVar4->off = uVar39 + 2;
          pZVar4->len = (U32)sVar18;
          uVar31 = 1;
          local_1a8 = (U32 *)sVar18;
          if (sVar18 <= ((ulong)local_100 & 0xffffffff) &&
              (BYTE *)(sVar18 + (long)puVar24) != pBVar2) goto LAB_0011b867;
          UVar10 = (int)local_108 + 1;
          uVar31 = 1;
          goto LAB_0011ba4c;
        }
      }
      uVar29 = uVar29 & 0xffffffff;
      iVar11 = pZVar5[uVar29].price;
      UVar9 = pZVar5[uVar29].off;
      uVar39 = pZVar5[uVar29].mlen;
      local_160._0_4_ = pZVar5[uVar29].litlen;
      local_58 = pZVar5[uVar29].rep[2];
      local_60 = *(undefined8 *)pZVar5[uVar29].rep;
      uVar34 = uVar8 - ((U32)local_160 + uVar39);
      if (uVar8 < (U32)local_160 + uVar39) {
        uVar34 = 0;
      }
      uVar29 = (ulong)uVar34;
    }
LAB_0011bca6:
    local_88 = CONCAT44(local_88._4_4_,iVar11);
    uVar8 = (int)uVar29 + 1;
    pZVar5[uVar8].price = iVar11;
    pZVar5[uVar8].off = UVar9;
    pZVar5[uVar8].mlen = uVar39;
    pZVar5[uVar8].litlen = (U32)local_160;
    *(undefined8 *)pZVar5[uVar8].rep = local_60;
    pZVar5[uVar8].rep[2] = local_58;
    uVar44 = uVar29;
    while (uVar39 = (uint)uVar29, src = local_a8, uVar39 != 0) {
      uVar34 = pZVar5[uVar29].litlen + pZVar5[uVar29].mlen;
      pZVar23 = pZVar5 + uVar29;
      iVar11 = pZVar23->price;
      UVar9 = pZVar23->off;
      UVar10 = pZVar23->mlen;
      UVar15 = pZVar23->litlen;
      pZVar23 = pZVar5 + uVar29;
      UVar14 = pZVar23->rep[0];
      uVar6 = *(undefined8 *)(&pZVar23->litlen + 2);
      pZVar3 = pZVar5 + uVar44;
      pZVar3->litlen = pZVar23->litlen;
      pZVar3->rep[0] = UVar14;
      *(undefined8 *)(&pZVar3->litlen + 2) = uVar6;
      pZVar23 = pZVar5 + uVar44;
      pZVar23->price = iVar11;
      pZVar23->off = UVar9;
      pZVar23->mlen = UVar10;
      pZVar23->litlen = UVar15;
      uVar29 = (ulong)(uVar39 - uVar34);
      if (uVar39 < uVar34) {
        uVar29 = 0;
      }
      uVar44 = (ulong)((int)uVar44 - 1);
    }
    while (uVar39 = (int)uVar44 + 1, uVar44 = (ulong)uVar39, uVar39 <= uVar8) {
      uVar39 = pZVar5[uVar44].litlen;
      uVar29 = (ulong)uVar39;
      UVar14 = pZVar5[uVar44].mlen;
      if (UVar14 == 0) {
        puVar45 = (uint *)(uVar29 + (long)src);
      }
      else {
        uVar34 = pZVar5[uVar44].off;
        if (uVar34 < 3) {
          uVar42 = (uVar29 == 0) + uVar34;
          if (uVar42 != 0) {
            if (uVar42 == 3) {
              UVar9 = *local_98 - 1;
LAB_0011bd93:
              local_98[2] = local_98[1];
            }
            else {
              UVar9 = local_98[uVar42];
              if (uVar42 != 1) goto LAB_0011bd93;
            }
            local_98[1] = *local_98;
            goto LAB_0011bd9e;
          }
        }
        else {
          *(undefined8 *)(local_98 + 1) = *(undefined8 *)local_98;
          UVar9 = uVar34 - 2;
LAB_0011bd9e:
          *local_98 = UVar9;
        }
        ZSTD_updateStats(local_b8,uVar39,(BYTE *)src,uVar34,UVar14);
        ZSTD_storeSeq(local_50,uVar29,src,uVar34,(ulong)(UVar14 - 3));
        src = (void *)((long)src + (ulong)(UVar14 + uVar39));
        puVar45 = (uint *)src;
      }
    }
    ZSTD_setBasePrices(local_b8,2);
    local_a8 = (uint *)src;
  }
  goto LAB_00119656;
LAB_0011b827:
  local_188 = (uint *)&local_f8;
  local_140 = local_178;
  goto LAB_0011ba43;
LAB_0011b813:
  local_140 = (uint *)&local_f8;
LAB_0011ba43:
  *local_188 = 0;
  *local_140 = 0;
  UVar10 = iVar17 - 8;
LAB_0011ba4c:
  ms->nextToUpdate = UVar10;
LAB_0011ba54:
  if ((int)uVar31 != 0) {
    uVar8 = (int)uVar31 - 1;
    uVar39 = pZVar4[uVar8].len;
    if (((uint)local_d8 < uVar39) || (0xfff < uVar39 + uVar34)) {
      UVar14 = 0;
      if (pZVar3->mlen == 0) {
        UVar14 = pZVar3->litlen;
      }
      UVar9 = pZVar4[uVar8].off;
      uVar8 = uVar34 - UVar14;
      if (0x1000 < uVar34 - UVar14) {
        uVar8 = 0;
      }
      uVar29 = (ulong)uVar8;
      iVar11 = (uint)local_88;
      goto LAB_0011bca6;
    }
    pUVar32 = (U32 *)((long)pZVar5->rep + local_c8);
    for (uVar44 = 0; uVar44 != uVar31; uVar44 = uVar44 + 1) {
      UVar10 = pZVar4[uVar44].off;
      rVar48 = ZSTD_updateRep(pUVar32,UVar10,(uint)(UVar14 != 0));
      uVar39 = (uint)local_48;
      if (uVar44 != 0) {
        uVar39 = pZVar4[uVar44 - 1].len + 1;
      }
      UVar15 = pZVar4[uVar44].len;
      uVar8 = 0x1f;
      if (UVar10 + 1 != 0) {
        for (; UVar10 + 1 >> uVar8 == 0; uVar8 = uVar8 - 1) {
        }
      }
      for (; uVar39 <= UVar15; UVar15 = UVar15 - 1) {
        if ((ms->opt).priceType == zop_predef) {
          uVar42 = UVar15 - 2;
          iVar13 = 0x1f;
          if (uVar42 != 0) {
            for (; uVar42 >> iVar13 == 0; iVar13 = iVar13 + -1) {
            }
          }
          iVar13 = (iVar13 + uVar8) * 0x100 + (uVar42 * 0x100 >> ((byte)iVar13 & 0x1f)) + 0x1000;
        }
        else {
          uVar40 = UVar15 - 3;
          uVar42 = (ms->opt).offCodeFreq[uVar8] + 1;
          iVar13 = 0x1f;
          if (uVar42 != 0) {
            for (; uVar42 >> iVar13 == 0; iVar13 = iVar13 + -1) {
            }
          }
          if (uVar40 < 0x80) {
            uVar40 = (uint)(byte)(&ZSTD_MLcode_ML_Code)[uVar40];
          }
          else {
            uVar35 = 0x1f;
            if (uVar40 != 0) {
              for (; uVar40 >> uVar35 == 0; uVar35 = uVar35 - 1) {
              }
            }
            uVar40 = (uVar35 ^ 0xffffffe0) + 0x44;
          }
          uVar35 = (ms->opt).matchLengthFreq[uVar40] + 1;
          iVar12 = 0x1f;
          if (uVar35 != 0) {
            for (; uVar35 >> iVar12 == 0; iVar12 = iVar12 + -1) {
            }
          }
          iVar13 = ((ML_bits[uVar40] + uVar8) - (iVar13 + iVar12)) * 0x100 +
                   (((ms->opt).offCodeSumBasePrice + (ms->opt).matchLengthSumBasePrice) -
                   ((uVar42 * 0x100 >> ((byte)iVar13 & 0x1f)) +
                   (uVar35 * 0x100 >> ((byte)iVar12 & 0x1f)))) + 0x33;
        }
        iVar13 = iVar13 + UVar9 + iVar11;
        uVar36 = (ulong)(UVar15 + uVar34);
        if (((uint)uVar29 < UVar15 + uVar34) || (iVar13 < pZVar5[uVar36].price)) {
          uVar29 = uVar29 & 0xffffffff;
          pZVar23 = local_70 + uVar29;
          for (; uVar29 < uVar36; uVar29 = uVar29 + 1) {
            pZVar23->price = 0x40000000;
            pZVar23 = pZVar23 + 1;
          }
          pZVar5[uVar36].mlen = UVar15;
          pZVar5[uVar36].off = UVar10;
          pZVar5[uVar36].litlen = (U32)local_160;
          pZVar5[uVar36].price = iVar13;
          *(long *)pZVar5[uVar36].rep = rVar48.rep._0_8_;
          pZVar5[uVar36].rep[2] = rVar48.rep[2];
        }
      }
    }
  }
LAB_0011bc59:
  uVar44 = (ulong)(uVar34 + 1);
  goto LAB_0011a867;
}

Assistant:

size_t ZSTD_compressBlock_btultra2(
        ZSTD_matchState_t* ms, seqStore_t* seqStore, U32 rep[ZSTD_REP_NUM],
        const void* src, size_t srcSize)
{
    U32 const current = (U32)((const BYTE*)src - ms->window.base);
    DEBUGLOG(5, "ZSTD_compressBlock_btultra2 (srcSize=%zu)", srcSize);

    /* 2-pass strategy:
     * this strategy makes a first pass over first block to collect statistics
     * and seed next round's statistics with it.
     * After 1st pass, function forgets everything, and starts a new block.
     * Consequently, this can only work if no data has been previously loaded in tables,
     * aka, no dictionary, no prefix, no ldm preprocessing.
     * The compression ratio gain is generally small (~0.5% on first block),
     * the cost is 2x cpu time on first block. */
    assert(srcSize <= ZSTD_BLOCKSIZE_MAX);
    if ( (ms->opt.litLengthSum==0)   /* first block */
      && (seqStore->sequences == seqStore->sequencesStart)  /* no ldm */
      && (ms->window.dictLimit == ms->window.lowLimit)   /* no dictionary */
      && (current == ms->window.dictLimit)   /* start of frame, nothing already loaded nor skipped */
      && (srcSize > ZSTD_PREDEF_THRESHOLD)
      ) {
        ZSTD_initStats_ultra(ms, seqStore, rep, src, srcSize);
    }

    return ZSTD_compressBlock_opt_generic(ms, seqStore, rep, src, srcSize, 2 /*optLevel*/, ZSTD_noDict);
}